

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_8,_1,_true,_embree::avx512::SubGridIntersectorKPluecker<8,_8,_true>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ushort uVar9;
  ushort uVar10;
  Geometry *pGVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  RTCRayQueryContext *pRVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  long lVar27;
  size_t k;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  vfloat_impl<8> vVar38;
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  ulong uVar58;
  int iVar59;
  uint uVar60;
  ulong uVar61;
  long lVar62;
  long lVar63;
  ulong uVar64;
  byte bVar65;
  byte bVar66;
  long lVar67;
  undefined1 auVar81 [16];
  float fVar112;
  undefined1 auVar82 [16];
  long lVar68;
  ulong *puVar69;
  byte bVar70;
  NodeRef root;
  ulong uVar71;
  undefined1 (*pauVar72) [32];
  undefined4 uVar73;
  uint *puVar74;
  byte bVar75;
  byte bVar76;
  bool bVar77;
  ulong uVar78;
  float fVar79;
  float fVar108;
  float fVar110;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  vfloat_impl<8> vVar102;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  vfloat_impl<8> vVar106;
  float fVar80;
  float fVar109;
  float fVar111;
  float fVar113;
  undefined1 auVar107 [32];
  float fVar114;
  float fVar118;
  float fVar119;
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [64];
  undefined1 auVar131 [32];
  undefined1 auVar130 [16];
  undefined1 auVar132 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar133 [64];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 in_ZMM9 [64];
  undefined1 auVar146 [64];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  float fVar147;
  undefined1 auVar151 [32];
  undefined1 auVar152 [64];
  float fVar153;
  float fVar154;
  float fVar155;
  undefined1 auVar156 [16];
  undefined1 auVar157 [64];
  undefined1 auVar158 [64];
  undefined1 auVar159 [32];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  undefined1 auVar164 [64];
  Precalculations pre;
  vfloat<8> upper_y;
  vfloat<8> lower_z;
  vfloat<8> upper_z;
  vfloat<8> lower_x;
  vfloat<8> t;
  vfloat<8> v;
  vfloat<8> lower_y;
  TravRayK<8,_true> tray;
  vfloat<8> upper_x;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  uint local_5f5c;
  Precalculations local_5f29;
  uint local_5f28;
  uint local_5f24;
  RTCFilterFunctionNArguments local_5f20;
  RayK<8> *local_5ef0;
  ulong local_5ee8;
  undefined4 local_5ee0;
  undefined4 local_5edc;
  undefined1 (*local_5ed8) [32];
  ulong *local_5ed0;
  ulong local_5ec8;
  undefined1 local_5ec0 [32];
  undefined1 local_5ea0 [32];
  BVH *local_5e68;
  Intersectors *local_5e60;
  long local_5e58;
  long local_5e50;
  long local_5e48;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_5e40;
  undefined8 local_5e20;
  undefined8 uStack_5e18;
  undefined8 local_5e10;
  undefined8 uStack_5e08;
  undefined1 local_5e00 [32];
  undefined1 local_5de0 [68];
  float fStack_5d9c;
  float fStack_5d98;
  float fStack_5d94;
  float fStack_5d90;
  float fStack_5d8c;
  float fStack_5d88;
  uint uStack_5d84;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_5d80;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_5d60;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_5d40;
  undefined1 local_5d20 [32];
  uint local_5d00;
  uint uStack_5cfc;
  uint uStack_5cf8;
  uint uStack_5cf4;
  uint uStack_5cf0;
  uint uStack_5cec;
  uint uStack_5ce8;
  uint uStack_5ce4;
  uint local_5ce0;
  uint uStack_5cdc;
  uint uStack_5cd8;
  uint uStack_5cd4;
  uint uStack_5cd0;
  uint uStack_5ccc;
  uint uStack_5cc8;
  uint uStack_5cc4;
  undefined1 local_5cc0 [32];
  undefined1 local_5ca0 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_5c80;
  undefined1 local_5c60 [16];
  undefined1 local_5c50 [16];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_5c40 [3];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5be0;
  undefined1 local_5b80 [32];
  undefined1 local_5b60 [32];
  undefined1 local_5b40 [32];
  undefined1 local_5b20 [8];
  float fStack_5b18;
  float fStack_5b14;
  float fStack_5b10;
  float fStack_5b0c;
  float fStack_5b08;
  undefined1 local_5b00 [8];
  float fStack_5af8;
  float fStack_5af4;
  float fStack_5af0;
  float fStack_5aec;
  float fStack_5ae8;
  undefined1 local_5ae0 [8];
  float fStack_5ad8;
  float fStack_5ad4;
  float fStack_5ad0;
  float fStack_5acc;
  float fStack_5ac8;
  int local_5ac0;
  int iStack_5abc;
  int iStack_5ab8;
  int iStack_5ab4;
  int iStack_5ab0;
  int iStack_5aac;
  int iStack_5aa8;
  int iStack_5aa4;
  uint local_5aa0;
  uint uStack_5a9c;
  uint uStack_5a98;
  uint uStack_5a94;
  uint uStack_5a90;
  uint uStack_5a8c;
  uint uStack_5a88;
  uint uStack_5a84;
  uint local_5a80;
  uint uStack_5a7c;
  uint uStack_5a78;
  uint uStack_5a74;
  uint uStack_5a70;
  uint uStack_5a6c;
  uint uStack_5a68;
  uint uStack_5a64;
  undefined1 local_5a60 [32];
  undefined1 local_5a40 [32];
  undefined1 local_5a20 [32];
  undefined8 local_5a00;
  undefined8 uStack_59f8;
  undefined1 local_59f0 [16];
  undefined8 local_59e0;
  undefined8 uStack_59d8;
  undefined8 local_59d0;
  undefined8 uStack_59c8;
  undefined1 local_59c0 [16];
  undefined8 local_59b0;
  undefined8 uStack_59a8;
  undefined1 local_59a0 [16];
  undefined8 local_5990;
  undefined8 uStack_5988;
  undefined1 local_5980 [16];
  undefined8 local_5970;
  undefined8 uStack_5968;
  undefined8 local_5960;
  undefined8 uStack_5958;
  undefined1 local_5950 [16];
  undefined8 local_5940;
  undefined8 uStack_5938;
  undefined1 local_5930 [16];
  undefined1 local_5920 [32];
  undefined1 local_5900 [32];
  undefined1 local_58e0 [32];
  undefined1 local_58c0 [32];
  undefined1 local_58a0 [32];
  undefined1 local_5880 [32];
  undefined1 local_5860 [32];
  undefined1 local_5840 [32];
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  
  local_5808 = (((BVH *)This->ptr)->root).ptr;
  if (local_5808 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar83 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar115 = ZEXT816(0) << 0x40;
      uVar78 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar115),5);
      uVar71 = vpcmpeqd_avx512vl(auVar83,(undefined1  [32])valid_i->field_0);
      uVar78 = uVar78 & uVar71;
      bVar70 = (byte)uVar78;
      if (bVar70 != 0) {
        local_5be0._0_8_ = *(undefined8 *)ray;
        local_5be0._8_8_ = *(undefined8 *)(ray + 8);
        local_5be0._16_8_ = *(undefined8 *)(ray + 0x10);
        local_5be0._24_8_ = *(undefined8 *)(ray + 0x18);
        local_5be0._32_8_ = *(undefined8 *)(ray + 0x20);
        local_5be0._40_8_ = *(undefined8 *)(ray + 0x28);
        local_5be0._48_8_ = *(undefined8 *)(ray + 0x30);
        local_5be0._56_8_ = *(undefined8 *)(ray + 0x38);
        local_5be0._64_8_ = *(undefined8 *)(ray + 0x40);
        local_5be0._72_8_ = *(undefined8 *)(ray + 0x48);
        local_5be0._80_8_ = *(undefined8 *)(ray + 0x50);
        local_5be0._88_8_ = *(undefined8 *)(ray + 0x58);
        local_5b80 = *(undefined1 (*) [32])(ray + 0x80);
        local_5b60 = *(undefined1 (*) [32])(ray + 0xa0);
        local_5b40 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar158 = ZEXT3264(auVar83);
        vandps_avx512vl(local_5b80,auVar83);
        auVar87._8_4_ = 0x219392ef;
        auVar87._0_8_ = 0x219392ef219392ef;
        auVar87._12_4_ = 0x219392ef;
        auVar87._16_4_ = 0x219392ef;
        auVar87._20_4_ = 0x219392ef;
        auVar87._24_4_ = 0x219392ef;
        auVar87._28_4_ = 0x219392ef;
        uVar71 = vcmpps_avx512vl(auVar83,auVar87,1);
        auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar160 = ZEXT3264(auVar84);
        auVar85 = vdivps_avx512vl(auVar84,local_5b80);
        vandps_avx512vl(local_5b60,auVar83);
        uVar64 = vcmpps_avx512vl(auVar85,auVar87,1);
        auVar86 = vdivps_avx512vl(auVar84,local_5b60);
        vandps_avx512vl(local_5b40,auVar83);
        uVar61 = vcmpps_avx512vl(auVar86,auVar87,1);
        auVar83 = vdivps_avx512vl(auVar84,local_5b40);
        auVar129 = ZEXT3264(CONCAT428(0x5d5e0b6b,
                                      CONCAT424(0x5d5e0b6b,
                                                CONCAT420(0x5d5e0b6b,
                                                          CONCAT416(0x5d5e0b6b,
                                                                    CONCAT412(0x5d5e0b6b,
                                                                              CONCAT48(0x5d5e0b6b,
                                                                                                                                                                              
                                                  0x5d5e0b6b5d5e0b6b)))))));
        bVar77 = (bool)((byte)uVar71 & 1);
        local_5b20._0_4_ = (uint)bVar77 * 0x5d5e0b6b | (uint)!bVar77 * auVar85._0_4_;
        bVar77 = (bool)((byte)(uVar71 >> 1) & 1);
        local_5b20._4_4_ = (uint)bVar77 * 0x5d5e0b6b | (uint)!bVar77 * auVar85._4_4_;
        bVar77 = (bool)((byte)(uVar71 >> 2) & 1);
        fStack_5b18 = (float)((uint)bVar77 * 0x5d5e0b6b | (uint)!bVar77 * auVar85._8_4_);
        bVar77 = (bool)((byte)(uVar71 >> 3) & 1);
        fStack_5b14 = (float)((uint)bVar77 * 0x5d5e0b6b | (uint)!bVar77 * auVar85._12_4_);
        bVar77 = (bool)((byte)(uVar71 >> 4) & 1);
        fStack_5b10 = (float)((uint)bVar77 * 0x5d5e0b6b | (uint)!bVar77 * auVar85._16_4_);
        bVar77 = (bool)((byte)(uVar71 >> 5) & 1);
        fStack_5b0c = (float)((uint)bVar77 * 0x5d5e0b6b | (uint)!bVar77 * auVar85._20_4_);
        bVar77 = (bool)((byte)(uVar71 >> 6) & 1);
        fStack_5b08 = (float)((uint)bVar77 * 0x5d5e0b6b | (uint)!bVar77 * auVar85._24_4_);
        bVar77 = SUB81(uVar71 >> 7,0);
        register0x00000918 = (uint)bVar77 * 0x5d5e0b6b | (uint)!bVar77 * auVar85._28_4_;
        bVar77 = (bool)((byte)uVar64 & 1);
        local_5b00._0_4_ = (uint)bVar77 * 0x5d5e0b6b | (uint)!bVar77 * auVar86._0_4_;
        bVar77 = (bool)((byte)(uVar64 >> 1) & 1);
        local_5b00._4_4_ = (uint)bVar77 * 0x5d5e0b6b | (uint)!bVar77 * auVar86._4_4_;
        bVar77 = (bool)((byte)(uVar64 >> 2) & 1);
        fStack_5af8 = (float)((uint)bVar77 * 0x5d5e0b6b | (uint)!bVar77 * auVar86._8_4_);
        bVar77 = (bool)((byte)(uVar64 >> 3) & 1);
        fStack_5af4 = (float)((uint)bVar77 * 0x5d5e0b6b | (uint)!bVar77 * auVar86._12_4_);
        bVar77 = (bool)((byte)(uVar64 >> 4) & 1);
        fStack_5af0 = (float)((uint)bVar77 * 0x5d5e0b6b | (uint)!bVar77 * auVar86._16_4_);
        bVar77 = (bool)((byte)(uVar64 >> 5) & 1);
        fStack_5aec = (float)((uint)bVar77 * 0x5d5e0b6b | (uint)!bVar77 * auVar86._20_4_);
        bVar77 = (bool)((byte)(uVar64 >> 6) & 1);
        fStack_5ae8 = (float)((uint)bVar77 * 0x5d5e0b6b | (uint)!bVar77 * auVar86._24_4_);
        bVar77 = SUB81(uVar64 >> 7,0);
        register0x00000918 = (uint)bVar77 * 0x5d5e0b6b | (uint)!bVar77 * auVar86._28_4_;
        bVar77 = (bool)((byte)uVar61 & 1);
        local_5ae0._0_4_ = (uint)bVar77 * 0x5d5e0b6b | (uint)!bVar77 * auVar83._0_4_;
        bVar77 = (bool)((byte)(uVar61 >> 1) & 1);
        local_5ae0._4_4_ = (uint)bVar77 * 0x5d5e0b6b | (uint)!bVar77 * auVar83._4_4_;
        bVar77 = (bool)((byte)(uVar61 >> 2) & 1);
        fStack_5ad8 = (float)((uint)bVar77 * 0x5d5e0b6b | (uint)!bVar77 * auVar83._8_4_);
        bVar77 = (bool)((byte)(uVar61 >> 3) & 1);
        fStack_5ad4 = (float)((uint)bVar77 * 0x5d5e0b6b | (uint)!bVar77 * auVar83._12_4_);
        bVar77 = (bool)((byte)(uVar61 >> 4) & 1);
        fStack_5ad0 = (float)((uint)bVar77 * 0x5d5e0b6b | (uint)!bVar77 * auVar83._16_4_);
        bVar77 = (bool)((byte)(uVar61 >> 5) & 1);
        fStack_5acc = (float)((uint)bVar77 * 0x5d5e0b6b | (uint)!bVar77 * auVar83._20_4_);
        bVar77 = (bool)((byte)(uVar61 >> 6) & 1);
        fStack_5ac8 = (float)((uint)bVar77 * 0x5d5e0b6b | (uint)!bVar77 * auVar83._24_4_);
        bVar77 = SUB81(uVar61 >> 7,0);
        register0x00000918 = (uint)bVar77 * 0x5d5e0b6b | (uint)!bVar77 * auVar83._28_4_;
        uVar71 = vcmpps_avx512vl(_local_5b20,ZEXT1632(auVar115),1);
        auVar83 = vpbroadcastd_avx512vl(ZEXT416(0x20));
        local_5ac0 = (uint)((byte)uVar71 & 1) * auVar83._0_4_;
        iStack_5abc = (uint)((byte)(uVar71 >> 1) & 1) * auVar83._4_4_;
        iStack_5ab8 = (uint)((byte)(uVar71 >> 2) & 1) * auVar83._8_4_;
        iStack_5ab4 = (uint)((byte)(uVar71 >> 3) & 1) * auVar83._12_4_;
        iStack_5ab0 = (uint)((byte)(uVar71 >> 4) & 1) * auVar83._16_4_;
        iStack_5aac = (uint)((byte)(uVar71 >> 5) & 1) * auVar83._20_4_;
        iStack_5aa8 = (uint)((byte)(uVar71 >> 6) & 1) * auVar83._24_4_;
        iStack_5aa4 = (uint)(byte)(uVar71 >> 7) * auVar83._28_4_;
        auVar84 = ZEXT1632(auVar115);
        uVar71 = vcmpps_avx512vl(_local_5b00,auVar84,5);
        auVar83 = vpbroadcastd_avx512vl(ZEXT416(0x40));
        bVar77 = (bool)((byte)uVar71 & 1);
        bVar15 = (bool)((byte)(uVar71 >> 1) & 1);
        bVar16 = (bool)((byte)(uVar71 >> 2) & 1);
        bVar17 = (bool)((byte)(uVar71 >> 3) & 1);
        bVar18 = (bool)((byte)(uVar71 >> 4) & 1);
        bVar19 = (bool)((byte)(uVar71 >> 5) & 1);
        bVar20 = (bool)((byte)(uVar71 >> 6) & 1);
        bVar21 = SUB81(uVar71 >> 7,0);
        local_5aa0 = (uint)bVar77 * auVar83._0_4_ | (uint)!bVar77 * 0x60;
        uStack_5a9c = (uint)bVar15 * auVar83._4_4_ | (uint)!bVar15 * 0x60;
        uStack_5a98 = (uint)bVar16 * auVar83._8_4_ | (uint)!bVar16 * 0x60;
        uStack_5a94 = (uint)bVar17 * auVar83._12_4_ | (uint)!bVar17 * 0x60;
        uStack_5a90 = (uint)bVar18 * auVar83._16_4_ | (uint)!bVar18 * 0x60;
        uStack_5a8c = (uint)bVar19 * auVar83._20_4_ | (uint)!bVar19 * 0x60;
        uStack_5a88 = (uint)bVar20 * auVar83._24_4_ | (uint)!bVar20 * 0x60;
        uStack_5a84 = (uint)bVar21 * auVar83._28_4_ | (uint)!bVar21 * 0x60;
        uVar71 = vcmpps_avx512vl(_local_5ae0,auVar84,5);
        auVar83 = vpbroadcastd_avx512vl(ZEXT416(0x80));
        bVar77 = (bool)((byte)uVar71 & 1);
        bVar15 = (bool)((byte)(uVar71 >> 1) & 1);
        bVar16 = (bool)((byte)(uVar71 >> 2) & 1);
        bVar17 = (bool)((byte)(uVar71 >> 3) & 1);
        bVar18 = (bool)((byte)(uVar71 >> 4) & 1);
        bVar19 = (bool)((byte)(uVar71 >> 5) & 1);
        bVar20 = (bool)((byte)(uVar71 >> 6) & 1);
        bVar21 = SUB81(uVar71 >> 7,0);
        local_5a80 = (uint)bVar77 * auVar83._0_4_ | (uint)!bVar77 * 0xa0;
        uStack_5a7c = (uint)bVar15 * auVar83._4_4_ | (uint)!bVar15 * 0xa0;
        uStack_5a78 = (uint)bVar16 * auVar83._8_4_ | (uint)!bVar16 * 0xa0;
        uStack_5a74 = (uint)bVar17 * auVar83._12_4_ | (uint)!bVar17 * 0xa0;
        uStack_5a70 = (uint)bVar18 * auVar83._16_4_ | (uint)!bVar18 * 0xa0;
        uStack_5a6c = (uint)bVar19 * auVar83._20_4_ | (uint)!bVar19 * 0xa0;
        uStack_5a68 = (uint)bVar20 * auVar83._24_4_ | (uint)!bVar20 * 0xa0;
        uStack_5a64 = (uint)bVar21 * auVar83._28_4_ | (uint)!bVar21 * 0xa0;
        local_4680 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar161 = ZEXT3264(local_4680);
        auVar83 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar84);
        local_5a60._0_4_ =
             (uint)(bVar70 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar70 & 1) * local_4680._0_4_;
        bVar77 = (bool)((byte)(uVar78 >> 1) & 1);
        local_5a60._4_4_ = (uint)bVar77 * auVar83._4_4_ | (uint)!bVar77 * local_4680._4_4_;
        bVar77 = (bool)((byte)(uVar78 >> 2) & 1);
        local_5a60._8_4_ = (uint)bVar77 * auVar83._8_4_ | (uint)!bVar77 * local_4680._8_4_;
        bVar77 = (bool)((byte)(uVar78 >> 3) & 1);
        local_5a60._12_4_ = (uint)bVar77 * auVar83._12_4_ | (uint)!bVar77 * local_4680._12_4_;
        bVar77 = (bool)((byte)(uVar78 >> 4) & 1);
        local_5a60._16_4_ = (uint)bVar77 * auVar83._16_4_ | (uint)!bVar77 * local_4680._16_4_;
        bVar77 = (bool)((byte)(uVar78 >> 5) & 1);
        local_5a60._20_4_ = (uint)bVar77 * auVar83._20_4_ | (uint)!bVar77 * local_4680._20_4_;
        bVar77 = (bool)((byte)(uVar78 >> 6) & 1);
        local_5a60._24_4_ = (uint)bVar77 * auVar83._24_4_ | (uint)!bVar77 * local_4680._24_4_;
        bVar77 = SUB81(uVar78 >> 7,0);
        local_5a60._28_4_ = (uint)bVar77 * auVar83._28_4_ | (uint)!bVar77 * local_4680._28_4_;
        local_5ee0 = (int)uVar78;
        auVar83 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar84);
        bVar77 = (bool)((byte)(uVar78 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar78 >> 2) & 1);
        bVar16 = (bool)((byte)(uVar78 >> 3) & 1);
        bVar17 = (bool)((byte)(uVar78 >> 4) & 1);
        bVar18 = (bool)((byte)(uVar78 >> 5) & 1);
        bVar19 = (bool)((byte)(uVar78 >> 6) & 1);
        bVar20 = SUB81(uVar78 >> 7,0);
        local_5a40._4_4_ = (uint)bVar77 * auVar83._4_4_ | (uint)!bVar77 * -0x800000;
        local_5a40._0_4_ =
             (uint)(bVar70 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar70 & 1) * -0x800000;
        local_5a40._8_4_ = (uint)bVar15 * auVar83._8_4_ | (uint)!bVar15 * -0x800000;
        local_5a40._12_4_ = (uint)bVar16 * auVar83._12_4_ | (uint)!bVar16 * -0x800000;
        local_5a40._16_4_ = (uint)bVar17 * auVar83._16_4_ | (uint)!bVar17 * -0x800000;
        local_5a40._20_4_ = (uint)bVar18 * auVar83._20_4_ | (uint)!bVar18 * -0x800000;
        local_5a40._24_4_ = (uint)bVar19 * auVar83._24_4_ | (uint)!bVar19 * -0x800000;
        local_5a40._28_4_ = (uint)bVar20 * auVar83._28_4_ | (uint)!bVar20 * -0x800000;
        local_5e60 = This;
        local_5e68 = (BVH *)This->ptr;
        local_5f5c = (uint)(byte)~bVar70;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar78 = 7;
        }
        else {
          uVar78 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
        }
        local_5ef0 = ray + 0x100;
        puVar69 = local_5800;
        local_5810 = 0xfffffffffffffff8;
        pauVar72 = (undefined1 (*) [32])local_4640;
        local_4660 = local_5a60;
        local_5ed8 = (undefined1 (*) [32])&local_5d00;
        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
        auVar162 = ZEXT3264(auVar83);
        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
        auVar163 = ZEXT3264(auVar83);
        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
        auVar164 = ZEXT3264(auVar83);
        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar157 = ZEXT3264(auVar83);
        local_5ee8 = uVar78;
LAB_01dee0a6:
        do {
          do {
            root.ptr = puVar69[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_01def9b6;
            puVar69 = puVar69 + -1;
            auVar83 = pauVar72[-1];
            auVar152 = ZEXT3264(auVar83);
            pauVar72 = pauVar72 + -1;
            uVar71 = vcmpps_avx512vl(auVar83,local_5a40,1);
          } while ((char)uVar71 == '\0');
          uVar73 = (undefined4)uVar71;
          if (uVar78 < (uint)POPCOUNT(uVar73)) {
LAB_01dee0ee:
            do {
              uVar71 = 8;
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_01def9b6;
                uVar24 = vcmpps_avx512vl(auVar152._0_32_,local_5a40,9);
                if ((char)uVar24 != '\0') {
                  local_5e58 = (ulong)((uint)root.ptr & 0xf) - 8;
                  uVar71 = root.ptr & 0xfffffffffffffff0;
                  bVar70 = ~(byte)local_5f5c;
                  local_5ed0 = puVar69;
                  lVar63 = 0;
                  while (lVar63 != local_5e58) {
                    local_5e50 = lVar63;
                    lVar63 = lVar63 * 0x90;
                    auVar115._8_8_ = 0;
                    auVar115._0_8_ = *(ulong *)(uVar71 + 0x40 + lVar63);
                    auVar81._8_8_ = 0;
                    auVar81._0_8_ = *(ulong *)(uVar71 + 0x48 + lVar63);
                    uVar64 = vpcmpub_avx512vl(auVar115,auVar81,2);
                    if ((char)uVar64 != '\0') {
                      lVar63 = lVar63 + uVar71;
                      uVar64 = uVar64 & 0xff;
                      local_5e48 = lVar63;
                      do {
                        auVar82._8_8_ = 0;
                        auVar82._0_8_ = *(ulong *)(lVar63 + 0x40);
                        auVar83 = vpmovzxbd_avx2(auVar82);
                        auVar83 = vcvtdq2ps_avx(auVar83);
                        uVar73 = *(undefined4 *)(lVar63 + 0x7c);
                        auVar93._4_4_ = uVar73;
                        auVar93._0_4_ = uVar73;
                        auVar93._8_4_ = uVar73;
                        auVar93._12_4_ = uVar73;
                        auVar93._16_4_ = uVar73;
                        auVar93._20_4_ = uVar73;
                        auVar93._24_4_ = uVar73;
                        auVar93._28_4_ = uVar73;
                        uVar73 = *(undefined4 *)(lVar63 + 0x70);
                        auVar96._4_4_ = uVar73;
                        auVar96._0_4_ = uVar73;
                        auVar96._8_4_ = uVar73;
                        auVar96._12_4_ = uVar73;
                        auVar96._16_4_ = uVar73;
                        auVar96._20_4_ = uVar73;
                        auVar96._24_4_ = uVar73;
                        auVar96._28_4_ = uVar73;
                        auVar115 = vfmadd213ps_fma(auVar83,auVar93,auVar96);
                        local_5de0._0_32_ = ZEXT1632(auVar115);
                        auVar156._8_8_ = 0;
                        auVar156._0_8_ = *(ulong *)(lVar63 + 0x48);
                        auVar83 = vpmovzxbd_avx2(auVar156);
                        auVar83 = vcvtdq2ps_avx(auVar83);
                        auVar115 = vfmadd213ps_fma(auVar83,auVar93,auVar96);
                        local_5a20 = ZEXT1632(auVar115);
                        auVar5._8_8_ = 0;
                        auVar5._0_8_ = *(ulong *)(lVar63 + 0x50);
                        auVar83 = vpmovzxbd_avx2(auVar5);
                        uVar73 = *(undefined4 *)(lVar63 + 0x80);
                        auVar94._4_4_ = uVar73;
                        auVar94._0_4_ = uVar73;
                        auVar94._8_4_ = uVar73;
                        auVar94._12_4_ = uVar73;
                        auVar94._16_4_ = uVar73;
                        auVar94._20_4_ = uVar73;
                        auVar94._24_4_ = uVar73;
                        auVar94._28_4_ = uVar73;
                        auVar83 = vcvtdq2ps_avx(auVar83);
                        uVar73 = *(undefined4 *)(lVar63 + 0x74);
                        auVar97._4_4_ = uVar73;
                        auVar97._0_4_ = uVar73;
                        auVar97._8_4_ = uVar73;
                        auVar97._12_4_ = uVar73;
                        auVar97._16_4_ = uVar73;
                        auVar97._20_4_ = uVar73;
                        auVar97._24_4_ = uVar73;
                        auVar97._28_4_ = uVar73;
                        auVar115 = vfmadd213ps_fma(auVar83,auVar94,auVar97);
                        local_5c40[0] =
                             (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)ZEXT1632(auVar115);
                        auVar6._8_8_ = 0;
                        auVar6._0_8_ = *(ulong *)(lVar63 + 0x58);
                        auVar83 = vpmovzxbd_avx2(auVar6);
                        auVar83 = vcvtdq2ps_avx(auVar83);
                        auVar115 = vfmadd213ps_fma(auVar83,auVar94,auVar97);
                        auVar83 = ZEXT1632(auVar115);
                        local_5f20.valid = (int *)auVar83._0_8_;
                        local_5f20.geometryUserPtr = (void *)auVar83._8_8_;
                        local_5f20.context = (RTCRayQueryContext *)auVar83._16_8_;
                        local_5f20.ray = (RTCRayN *)auVar83._24_8_;
                        auVar7._8_8_ = 0;
                        auVar7._0_8_ = *(ulong *)(lVar63 + 0x60);
                        auVar83 = vpmovzxbd_avx2(auVar7);
                        uVar73 = *(undefined4 *)(lVar63 + 0x84);
                        auVar95._4_4_ = uVar73;
                        auVar95._0_4_ = uVar73;
                        auVar95._8_4_ = uVar73;
                        auVar95._12_4_ = uVar73;
                        auVar95._16_4_ = uVar73;
                        auVar95._20_4_ = uVar73;
                        auVar95._24_4_ = uVar73;
                        auVar95._28_4_ = uVar73;
                        uVar73 = *(undefined4 *)(lVar63 + 0x78);
                        auVar98._4_4_ = uVar73;
                        auVar98._0_4_ = uVar73;
                        auVar98._8_4_ = uVar73;
                        auVar98._12_4_ = uVar73;
                        auVar98._16_4_ = uVar73;
                        auVar98._20_4_ = uVar73;
                        auVar98._24_4_ = uVar73;
                        auVar98._28_4_ = uVar73;
                        auVar83 = vcvtdq2ps_avx(auVar83);
                        auVar115 = vfmadd213ps_fma(auVar83,auVar95,auVar98);
                        local_5ea0 = ZEXT1632(auVar115);
                        auVar8._8_8_ = 0;
                        auVar8._0_8_ = *(ulong *)(lVar63 + 0x68);
                        auVar83 = vpmovzxbd_avx2(auVar8);
                        lVar27 = 0;
                        for (uVar61 = uVar64; (uVar61 & 1) == 0;
                            uVar61 = uVar61 >> 1 | 0x8000000000000000) {
                          lVar27 = lVar27 + 1;
                        }
                        auVar83 = vcvtdq2ps_avx(auVar83);
                        auVar115 = vfmadd213ps_fma(auVar83,auVar95,auVar98);
                        local_5e40 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                                     ZEXT1632(auVar115);
                        uVar61 = (ulong)(uint)((int)lVar27 * 4);
                        uVar73 = *(undefined4 *)(local_5de0 + uVar61);
                        auVar83._4_4_ = uVar73;
                        auVar83._0_4_ = uVar73;
                        auVar83._8_4_ = uVar73;
                        auVar83._12_4_ = uVar73;
                        auVar83._16_4_ = uVar73;
                        auVar83._20_4_ = uVar73;
                        auVar83._24_4_ = uVar73;
                        auVar83._28_4_ = uVar73;
                        auVar55._8_8_ = local_5be0._8_8_;
                        auVar55._0_8_ = local_5be0._0_8_;
                        auVar55._16_8_ = local_5be0._16_8_;
                        auVar55._24_8_ = local_5be0._24_8_;
                        auVar56._8_8_ = local_5be0._40_8_;
                        auVar56._0_8_ = local_5be0._32_8_;
                        auVar56._16_8_ = local_5be0._48_8_;
                        auVar56._24_8_ = local_5be0._56_8_;
                        auVar57._8_8_ = local_5be0._72_8_;
                        auVar57._0_8_ = local_5be0._64_8_;
                        auVar57._16_8_ = local_5be0._80_8_;
                        auVar57._24_8_ = local_5be0._88_8_;
                        auVar83 = vsubps_avx(auVar83,auVar55);
                        auVar99._4_4_ = (float)local_5b20._4_4_ * auVar83._4_4_;
                        auVar99._0_4_ = (float)local_5b20._0_4_ * auVar83._0_4_;
                        auVar99._8_4_ = fStack_5b18 * auVar83._8_4_;
                        auVar99._12_4_ = fStack_5b14 * auVar83._12_4_;
                        auVar99._16_4_ = fStack_5b10 * auVar83._16_4_;
                        auVar99._20_4_ = fStack_5b0c * auVar83._20_4_;
                        auVar99._24_4_ = fStack_5b08 * auVar83._24_4_;
                        auVar99._28_4_ = auVar83._28_4_;
                        uVar73 = *(undefined4 *)((long)local_5c40 + uVar61);
                        auVar127._4_4_ = uVar73;
                        auVar127._0_4_ = uVar73;
                        auVar127._8_4_ = uVar73;
                        auVar127._12_4_ = uVar73;
                        auVar127._16_4_ = uVar73;
                        auVar127._20_4_ = uVar73;
                        auVar127._24_4_ = uVar73;
                        auVar127._28_4_ = uVar73;
                        auVar83 = vsubps_avx(auVar127,auVar56);
                        auVar101._4_4_ = (float)local_5b00._4_4_ * auVar83._4_4_;
                        auVar101._0_4_ = (float)local_5b00._0_4_ * auVar83._0_4_;
                        auVar101._8_4_ = fStack_5af8 * auVar83._8_4_;
                        auVar101._12_4_ = fStack_5af4 * auVar83._12_4_;
                        auVar101._16_4_ = fStack_5af0 * auVar83._16_4_;
                        auVar101._20_4_ = fStack_5aec * auVar83._20_4_;
                        auVar101._24_4_ = fStack_5ae8 * auVar83._24_4_;
                        auVar101._28_4_ = auVar83._28_4_;
                        auVar129 = ZEXT3264(auVar101);
                        uVar73 = *(undefined4 *)(local_5ea0 + uVar61);
                        auVar131._4_4_ = uVar73;
                        auVar131._0_4_ = uVar73;
                        auVar131._8_4_ = uVar73;
                        auVar131._12_4_ = uVar73;
                        auVar131._16_4_ = uVar73;
                        auVar131._20_4_ = uVar73;
                        auVar131._24_4_ = uVar73;
                        auVar131._28_4_ = uVar73;
                        auVar83 = vsubps_avx(auVar131,auVar57);
                        auVar103._4_4_ = (float)local_5ae0._4_4_ * auVar83._4_4_;
                        auVar103._0_4_ = (float)local_5ae0._0_4_ * auVar83._0_4_;
                        auVar103._8_4_ = fStack_5ad8 * auVar83._8_4_;
                        auVar103._12_4_ = fStack_5ad4 * auVar83._12_4_;
                        auVar103._16_4_ = fStack_5ad0 * auVar83._16_4_;
                        auVar103._20_4_ = fStack_5acc * auVar83._20_4_;
                        auVar103._24_4_ = fStack_5ac8 * auVar83._24_4_;
                        auVar103._28_4_ = auVar83._28_4_;
                        in_ZMM7 = ZEXT3264(auVar103);
                        uVar73 = *(undefined4 *)(local_5a20 + uVar61);
                        auVar142._4_4_ = uVar73;
                        auVar142._0_4_ = uVar73;
                        auVar142._8_4_ = uVar73;
                        auVar142._12_4_ = uVar73;
                        auVar142._16_4_ = uVar73;
                        auVar142._20_4_ = uVar73;
                        auVar142._24_4_ = uVar73;
                        auVar142._28_4_ = uVar73;
                        in_ZMM9 = ZEXT3264(auVar142);
                        auVar83 = vsubps_avx(auVar142,auVar55);
                        auVar104._4_4_ = (float)local_5b20._4_4_ * auVar83._4_4_;
                        auVar104._0_4_ = (float)local_5b20._0_4_ * auVar83._0_4_;
                        auVar104._8_4_ = fStack_5b18 * auVar83._8_4_;
                        auVar104._12_4_ = fStack_5b14 * auVar83._12_4_;
                        auVar104._16_4_ = fStack_5b10 * auVar83._16_4_;
                        auVar104._20_4_ = fStack_5b0c * auVar83._20_4_;
                        auVar104._24_4_ = fStack_5b08 * auVar83._24_4_;
                        auVar104._28_4_ = auVar83._28_4_;
                        uVar73 = *(undefined4 *)((long)&local_5f20.valid + uVar61);
                        auVar125._4_4_ = uVar73;
                        auVar125._0_4_ = uVar73;
                        auVar125._8_4_ = uVar73;
                        auVar125._12_4_ = uVar73;
                        auVar125._16_4_ = uVar73;
                        auVar125._20_4_ = uVar73;
                        auVar125._24_4_ = uVar73;
                        auVar125._28_4_ = uVar73;
                        auVar83 = vsubps_avx(auVar125,auVar56);
                        auVar105._4_4_ = (float)local_5b00._4_4_ * auVar83._4_4_;
                        auVar105._0_4_ = (float)local_5b00._0_4_ * auVar83._0_4_;
                        auVar105._8_4_ = fStack_5af8 * auVar83._8_4_;
                        auVar105._12_4_ = fStack_5af4 * auVar83._12_4_;
                        auVar105._16_4_ = fStack_5af0 * auVar83._16_4_;
                        auVar105._20_4_ = fStack_5aec * auVar83._20_4_;
                        auVar105._24_4_ = fStack_5ae8 * auVar83._24_4_;
                        auVar105._28_4_ = auVar83._28_4_;
                        uVar73 = *(undefined4 *)((long)&local_5e40 + uVar61);
                        auVar126._4_4_ = uVar73;
                        auVar126._0_4_ = uVar73;
                        auVar126._8_4_ = uVar73;
                        auVar126._12_4_ = uVar73;
                        auVar126._16_4_ = uVar73;
                        auVar126._20_4_ = uVar73;
                        auVar126._24_4_ = uVar73;
                        auVar126._28_4_ = uVar73;
                        auVar83 = vsubps_avx(auVar126,auVar57);
                        auVar30._4_4_ = (float)local_5ae0._4_4_ * auVar83._4_4_;
                        auVar30._0_4_ = (float)local_5ae0._0_4_ * auVar83._0_4_;
                        auVar30._8_4_ = fStack_5ad8 * auVar83._8_4_;
                        auVar30._12_4_ = fStack_5ad4 * auVar83._12_4_;
                        auVar30._16_4_ = fStack_5ad0 * auVar83._16_4_;
                        auVar30._20_4_ = fStack_5acc * auVar83._20_4_;
                        auVar30._24_4_ = fStack_5ac8 * auVar83._24_4_;
                        auVar30._28_4_ = auVar83._28_4_;
                        auVar83 = vminps_avx(auVar99,auVar104);
                        auVar84 = vminps_avx(auVar101,auVar105);
                        auVar83 = vmaxps_avx(auVar83,auVar84);
                        auVar84 = vminps_avx(auVar103,auVar30);
                        auVar83 = vmaxps_avx(auVar83,auVar84);
                        auVar85 = vmulps_avx512vl(auVar83,auVar162._0_32_);
                        auVar83 = vmaxps_avx(auVar99,auVar104);
                        auVar84 = vmaxps_avx(auVar101,auVar105);
                        auVar84 = vminps_avx(auVar83,auVar84);
                        auVar83 = vmaxps_avx(auVar103,auVar30);
                        auVar83 = vminps_avx(auVar84,auVar83);
                        auVar84 = vmulps_avx512vl(auVar83,auVar163._0_32_);
                        auVar83 = vmaxps_avx(auVar85,local_5a60);
                        auVar84 = vminps_avx(auVar84,local_5a40);
                        uVar24 = vcmpps_avx512vl(auVar83,auVar84,2);
                        if ((bVar70 & (byte)uVar24) == 0) {
                          bVar77 = false;
                        }
                        else {
                          local_5ec8 = uVar64;
                          uVar9 = *(ushort *)(lVar63 + lVar27 * 8);
                          uVar10 = *(ushort *)(lVar63 + 2 + lVar27 * 8);
                          pGVar11 = (context->scene->geometries).items[*(uint *)(lVar63 + 0x88)].ptr
                          ;
                          lVar12 = *(long *)&pGVar11->field_0x58;
                          lVar62 = (ulong)*(uint *)(lVar63 + 4 + lVar27 * 8) *
                                   pGVar11[1].super_RefCount.refCounter.
                                   super___atomic_base<unsigned_long>._M_i;
                          lVar27 = *(long *)&pGVar11[1].time_range.upper;
                          local_5f24 = uVar9 & 0x7fff;
                          local_5f28 = uVar10 & 0x7fff;
                          uVar60 = *(uint *)(lVar12 + 4 + lVar62);
                          uVar78 = (ulong)uVar60;
                          uVar61 = (ulong)(uVar60 * local_5f28 +
                                          *(int *)(lVar12 + lVar62) + local_5f24);
                          p_Var13 = pGVar11[1].intersectionFilterN;
                          puVar1 = (undefined8 *)(lVar27 + (uVar61 + 1) * (long)p_Var13);
                          local_5a20._16_8_ = *puVar1;
                          local_5a20._24_8_ = puVar1[1];
                          lVar63 = uVar61 + uVar78;
                          local_59f0 = *(undefined1 (*) [16])(lVar27 + lVar63 * (long)p_Var13);
                          lVar67 = uVar61 + uVar78 + 1;
                          puVar1 = (undefined8 *)(lVar27 + lVar67 * (long)p_Var13);
                          local_5a00 = *puVar1;
                          uStack_59f8 = puVar1[1];
                          local_5c50 = vpbroadcastd_avx512vl();
                          uVar64 = (ulong)(-1 < (short)uVar9);
                          puVar1 = (undefined8 *)(lVar27 + (uVar61 + uVar64 + 1) * (long)p_Var13);
                          lVar68 = uVar64 + lVar67;
                          local_59c0 = *(undefined1 (*) [16])(lVar27 + lVar68 * (long)p_Var13);
                          auVar129 = ZEXT1664(local_59c0);
                          if ((short)uVar10 < 0) {
                            uVar78 = 0;
                          }
                          puVar2 = (undefined8 *)(lVar27 + (lVar63 + uVar78) * (long)p_Var13);
                          local_5980 = *(undefined1 (*) [16])
                                        (lVar27 + (lVar67 + uVar78) * (long)p_Var13);
                          in_ZMM7 = ZEXT1664(local_5980);
                          puVar3 = (undefined8 *)(lVar27 + (uVar78 + lVar68) * (long)p_Var13);
                          local_5a20._0_16_ =
                               *(undefined1 (*) [16])(lVar27 + (long)p_Var13 * uVar61);
                          local_59e0 = local_5a20._16_8_;
                          uStack_59d8 = local_5a20._24_8_;
                          local_59d0 = *puVar1;
                          uStack_59c8 = puVar1[1];
                          local_59b0 = local_5a00;
                          uStack_59a8 = uStack_59f8;
                          local_59a0 = local_59f0;
                          local_5990 = local_5a00;
                          uStack_5988 = uStack_59f8;
                          local_5970 = *puVar2;
                          uStack_5968 = puVar2[1];
                          local_5960 = local_5a00;
                          uStack_5958 = uStack_59f8;
                          local_5950 = local_59c0;
                          local_5940 = *puVar3;
                          uStack_5938 = puVar3[1];
                          local_5930 = local_5980;
                          local_5c60 = vpbroadcastd_avx512vl();
                          puVar74 = (uint *)(local_59f0 + 8);
                          lVar63 = 0;
                          bVar66 = bVar70;
                          do {
                            if (lVar63 == 4) goto LAB_01def816;
                            uVar60 = puVar74[-0xe];
                            auVar116._4_4_ = uVar60;
                            auVar116._0_4_ = uVar60;
                            auVar116._8_4_ = uVar60;
                            auVar116._12_4_ = uVar60;
                            auVar116._16_4_ = uVar60;
                            auVar116._20_4_ = uVar60;
                            auVar116._24_4_ = uVar60;
                            auVar116._28_4_ = uVar60;
                            uVar60 = puVar74[-0xd];
                            auVar120._4_4_ = uVar60;
                            auVar120._0_4_ = uVar60;
                            auVar120._8_4_ = uVar60;
                            auVar120._12_4_ = uVar60;
                            auVar120._16_4_ = uVar60;
                            auVar120._20_4_ = uVar60;
                            auVar120._24_4_ = uVar60;
                            auVar120._28_4_ = uVar60;
                            uVar60 = puVar74[-0xc];
                            auVar122._4_4_ = uVar60;
                            auVar122._0_4_ = uVar60;
                            auVar122._8_4_ = uVar60;
                            auVar122._12_4_ = uVar60;
                            auVar122._16_4_ = uVar60;
                            auVar122._20_4_ = uVar60;
                            auVar122._24_4_ = uVar60;
                            auVar122._28_4_ = uVar60;
                            uVar60 = puVar74[-10];
                            local_5cc0._4_4_ = uVar60;
                            local_5cc0._0_4_ = uVar60;
                            local_5cc0._8_4_ = uVar60;
                            local_5cc0._12_4_ = uVar60;
                            local_5cc0._16_4_ = uVar60;
                            local_5cc0._20_4_ = uVar60;
                            local_5cc0._24_4_ = uVar60;
                            local_5cc0._28_4_ = uVar60;
                            uVar60 = puVar74[-9];
                            local_5840._4_4_ = uVar60;
                            local_5840._0_4_ = uVar60;
                            local_5840._8_4_ = uVar60;
                            local_5840._12_4_ = uVar60;
                            local_5840._16_4_ = uVar60;
                            local_5840._20_4_ = uVar60;
                            local_5840._24_4_ = uVar60;
                            local_5840._28_4_ = uVar60;
                            uVar60 = puVar74[-8];
                            local_5860._4_4_ = uVar60;
                            local_5860._0_4_ = uVar60;
                            local_5860._8_4_ = uVar60;
                            local_5860._12_4_ = uVar60;
                            local_5860._16_4_ = uVar60;
                            local_5860._20_4_ = uVar60;
                            local_5860._24_4_ = uVar60;
                            local_5860._28_4_ = uVar60;
                            uVar60 = puVar74[-2];
                            local_5880._4_4_ = uVar60;
                            local_5880._0_4_ = uVar60;
                            local_5880._8_4_ = uVar60;
                            local_5880._12_4_ = uVar60;
                            local_5880._16_4_ = uVar60;
                            local_5880._20_4_ = uVar60;
                            local_5880._24_4_ = uVar60;
                            local_5880._28_4_ = uVar60;
                            local_58a0 = vbroadcastss_avx512vl(ZEXT416(puVar74[-1]));
                            local_58c0 = vbroadcastss_avx512vl(ZEXT416(*puVar74));
                            local_5e10 = local_5c60._0_8_;
                            uStack_5e08 = local_5c60._8_8_;
                            local_5e20 = local_5c50._0_8_;
                            uStack_5e18 = local_5c50._8_8_;
                            auVar83 = *(undefined1 (*) [32])ray;
                            auVar84 = *(undefined1 (*) [32])(ray + 0x20);
                            auVar85 = *(undefined1 (*) [32])(ray + 0x40);
                            auVar86 = *(undefined1 (*) [32])(ray + 0x80);
                            in_ZMM9 = ZEXT3264(auVar86);
                            auVar87 = *(undefined1 (*) [32])(ray + 0xa0);
                            auVar159 = *(undefined1 (*) [32])(ray + 0xc0);
                            auVar107 = vsubps_avx(auVar116,auVar83);
                            in_ZMM7 = ZEXT3264(auVar107);
                            auVar22 = vsubps_avx(auVar120,auVar84);
                            auVar23 = vsubps_avx(auVar122,auVar85);
                            auVar100 = vsubps_avx(local_5cc0,auVar83);
                            auVar88 = vsubps_avx512vl(local_5840,auVar84);
                            auVar89 = vsubps_avx512vl(local_5860,auVar85);
                            auVar90 = vsubps_avx512vl(local_5880,auVar83);
                            auVar91 = vsubps_avx512vl(local_58a0,auVar84);
                            auVar85 = vsubps_avx512vl(local_58c0,auVar85);
                            auVar92 = vsubps_avx512vl(auVar90,auVar107);
                            auVar93 = vsubps_avx512vl(auVar91,auVar22);
                            auVar84 = vsubps_avx(auVar85,auVar23);
                            auVar94 = vsubps_avx512vl(auVar107,auVar100);
                            auVar95 = vsubps_avx512vl(auVar22,auVar88);
                            auVar96 = vsubps_avx512vl(auVar23,auVar89);
                            auVar97 = vaddps_avx512vl(auVar90,auVar107);
                            auVar98 = vaddps_avx512vl(auVar91,auVar22);
                            auVar123._0_4_ = auVar23._0_4_ + auVar85._0_4_;
                            auVar123._4_4_ = auVar23._4_4_ + auVar85._4_4_;
                            auVar123._8_4_ = auVar23._8_4_ + auVar85._8_4_;
                            auVar123._12_4_ = auVar23._12_4_ + auVar85._12_4_;
                            auVar123._16_4_ = auVar23._16_4_ + auVar85._16_4_;
                            auVar123._20_4_ = auVar23._20_4_ + auVar85._20_4_;
                            auVar123._24_4_ = auVar23._24_4_ + auVar85._24_4_;
                            auVar123._28_4_ = auVar23._28_4_ + auVar85._28_4_;
                            auVar31._4_4_ = auVar84._4_4_ * auVar98._4_4_;
                            auVar31._0_4_ = auVar84._0_4_ * auVar98._0_4_;
                            auVar31._8_4_ = auVar84._8_4_ * auVar98._8_4_;
                            auVar31._12_4_ = auVar84._12_4_ * auVar98._12_4_;
                            auVar31._16_4_ = auVar84._16_4_ * auVar98._16_4_;
                            auVar31._20_4_ = auVar84._20_4_ * auVar98._20_4_;
                            auVar31._24_4_ = auVar84._24_4_ * auVar98._24_4_;
                            auVar31._28_4_ = auVar83._28_4_;
                            auVar81 = vfmsub231ps_fma(auVar31,auVar93,auVar123);
                            auVar32._4_4_ = auVar92._4_4_ * auVar123._4_4_;
                            auVar32._0_4_ = auVar92._0_4_ * auVar123._0_4_;
                            auVar32._8_4_ = auVar92._8_4_ * auVar123._8_4_;
                            auVar32._12_4_ = auVar92._12_4_ * auVar123._12_4_;
                            auVar32._16_4_ = auVar92._16_4_ * auVar123._16_4_;
                            auVar32._20_4_ = auVar92._20_4_ * auVar123._20_4_;
                            auVar32._24_4_ = auVar92._24_4_ * auVar123._24_4_;
                            auVar32._28_4_ = auVar123._28_4_;
                            auVar115 = vfmsub231ps_fma(auVar32,auVar84,auVar97);
                            auVar33._4_4_ = auVar93._4_4_ * auVar97._4_4_;
                            auVar33._0_4_ = auVar93._0_4_ * auVar97._0_4_;
                            auVar33._8_4_ = auVar93._8_4_ * auVar97._8_4_;
                            auVar33._12_4_ = auVar93._12_4_ * auVar97._12_4_;
                            auVar33._16_4_ = auVar93._16_4_ * auVar97._16_4_;
                            auVar33._20_4_ = auVar93._20_4_ * auVar97._20_4_;
                            auVar33._24_4_ = auVar93._24_4_ * auVar97._24_4_;
                            auVar33._28_4_ = auVar97._28_4_;
                            auVar82 = vfmsub231ps_fma(auVar33,auVar92,auVar98);
                            fVar80 = auVar159._0_4_;
                            auVar117._0_4_ = fVar80 * auVar82._0_4_;
                            fVar108 = auVar159._4_4_;
                            auVar117._4_4_ = fVar108 * auVar82._4_4_;
                            fVar109 = auVar159._8_4_;
                            auVar117._8_4_ = fVar109 * auVar82._8_4_;
                            fVar110 = auVar159._12_4_;
                            auVar117._12_4_ = fVar110 * auVar82._12_4_;
                            fVar111 = auVar159._16_4_;
                            auVar117._16_4_ = fVar111 * 0.0;
                            fVar112 = auVar159._20_4_;
                            auVar117._20_4_ = fVar112 * 0.0;
                            fVar113 = auVar159._24_4_;
                            auVar117._24_4_ = fVar113 * 0.0;
                            auVar117._28_4_ = 0;
                            auVar115 = vfmadd231ps_fma(auVar117,auVar87,ZEXT1632(auVar115));
                            auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar86,ZEXT1632(auVar81))
                            ;
                            auVar121._0_4_ = auVar107._0_4_ + auVar100._0_4_;
                            auVar121._4_4_ = auVar107._4_4_ + auVar100._4_4_;
                            auVar121._8_4_ = auVar107._8_4_ + auVar100._8_4_;
                            auVar121._12_4_ = auVar107._12_4_ + auVar100._12_4_;
                            auVar121._16_4_ = auVar107._16_4_ + auVar100._16_4_;
                            auVar121._20_4_ = auVar107._20_4_ + auVar100._20_4_;
                            auVar121._24_4_ = auVar107._24_4_ + auVar100._24_4_;
                            auVar121._28_4_ = auVar107._28_4_ + auVar100._28_4_;
                            auVar83 = vaddps_avx512vl(auVar22,auVar88);
                            auVar97 = vaddps_avx512vl(auVar23,auVar89);
                            auVar98 = vmulps_avx512vl(auVar83,auVar96);
                            auVar98 = vfmsub231ps_avx512vl(auVar98,auVar95,auVar97);
                            auVar97 = vmulps_avx512vl(auVar97,auVar94);
                            auVar97 = vfmsub231ps_avx512vl(auVar97,auVar96,auVar121);
                            auVar99 = vmulps_avx512vl(auVar121,auVar95);
                            auVar83 = vfmsub231ps_avx512vl(auVar99,auVar94,auVar83);
                            auVar99 = vsubps_avx512vl(auVar100,auVar90);
                            auVar34._4_4_ = fVar108 * auVar83._4_4_;
                            auVar34._0_4_ = fVar80 * auVar83._0_4_;
                            auVar34._8_4_ = fVar109 * auVar83._8_4_;
                            auVar34._12_4_ = fVar110 * auVar83._12_4_;
                            auVar34._16_4_ = fVar111 * auVar83._16_4_;
                            auVar34._20_4_ = fVar112 * auVar83._20_4_;
                            auVar34._24_4_ = fVar113 * auVar83._24_4_;
                            auVar34._28_4_ = auVar83._28_4_;
                            auVar83 = vfmadd231ps_avx512vl(auVar34,auVar87,auVar97);
                            auVar97 = vsubps_avx512vl(auVar88,auVar91);
                            auVar81 = vfmadd231ps_fma(auVar83,auVar86,auVar98);
                            auVar83 = vsubps_avx512vl(auVar89,auVar85);
                            auVar100 = vaddps_avx512vl(auVar100,auVar90);
                            auVar88 = vaddps_avx512vl(auVar88,auVar91);
                            auVar85 = vaddps_avx512vl(auVar89,auVar85);
                            auVar89 = vmulps_avx512vl(auVar88,auVar83);
                            auVar89 = vfmsub231ps_avx512vl(auVar89,auVar97,auVar85);
                            auVar35._4_4_ = auVar85._4_4_ * auVar99._4_4_;
                            auVar35._0_4_ = auVar85._0_4_ * auVar99._0_4_;
                            auVar35._8_4_ = auVar85._8_4_ * auVar99._8_4_;
                            auVar35._12_4_ = auVar85._12_4_ * auVar99._12_4_;
                            auVar35._16_4_ = auVar85._16_4_ * auVar99._16_4_;
                            auVar35._20_4_ = auVar85._20_4_ * auVar99._20_4_;
                            auVar35._24_4_ = auVar85._24_4_ * auVar99._24_4_;
                            auVar35._28_4_ = auVar85._28_4_;
                            auVar82 = vfmsub231ps_fma(auVar35,auVar83,auVar100);
                            auVar36._4_4_ = auVar100._4_4_ * auVar97._4_4_;
                            auVar36._0_4_ = auVar100._0_4_ * auVar97._0_4_;
                            auVar36._8_4_ = auVar100._8_4_ * auVar97._8_4_;
                            auVar36._12_4_ = auVar100._12_4_ * auVar97._12_4_;
                            auVar36._16_4_ = auVar100._16_4_ * auVar97._16_4_;
                            auVar36._20_4_ = auVar100._20_4_ * auVar97._20_4_;
                            auVar36._24_4_ = auVar100._24_4_ * auVar97._24_4_;
                            auVar36._28_4_ = auVar100._28_4_;
                            auVar85 = vfmsub231ps_avx512vl(auVar36,auVar99,auVar88);
                            auVar85 = vmulps_avx512vl(auVar85,auVar159);
                            auVar85 = vfmadd231ps_avx512vl(auVar85,auVar87,ZEXT1632(auVar82));
                            auVar85 = vfmadd231ps_avx512vl(auVar85,auVar86,auVar89);
                            fVar153 = auVar81._0_4_;
                            fVar114 = auVar115._0_4_;
                            fVar147 = auVar81._4_4_;
                            fVar118 = auVar115._4_4_;
                            fVar154 = auVar81._8_4_;
                            fVar119 = auVar115._8_4_;
                            fVar155 = auVar81._12_4_;
                            fVar79 = auVar115._12_4_;
                            auVar100 = vaddps_avx512vl(auVar85,ZEXT1632(CONCAT412(fVar79 + fVar155,
                                                                                  CONCAT48(fVar119 +
                                                                                           fVar154,
                                                  CONCAT44(fVar118 + fVar147,fVar114 + fVar153)))));
                            auVar129 = ZEXT3264(auVar100);
                            auVar91 = auVar158._0_32_;
                            vandps_avx512vl(auVar100,auVar91);
                            auVar88 = vmulps_avx512vl(auVar100,auVar164._0_32_);
                            auVar89 = vminps_avx512vl(ZEXT1632(auVar115),ZEXT1632(auVar81));
                            auVar89 = vminps_avx512vl(auVar89,auVar85);
                            auVar90 = vxorps_avx512vl(auVar88,auVar157._0_32_);
                            uVar24 = vcmpps_avx512vl(auVar89,auVar90,5);
                            auVar89 = vmaxps_avx512vl(ZEXT1632(auVar115),ZEXT1632(auVar81));
                            auVar85 = vmaxps_avx512vl(auVar89,auVar85);
                            local_58e0 = vbroadcastss_avx512vl(ZEXT416(puVar74[-6]));
                            uVar25 = vcmpps_avx512vl(auVar85,auVar88,2);
                            local_5900 = vbroadcastss_avx512vl(ZEXT416(puVar74[-5]));
                            local_5920 = vbroadcastss_avx512vl(ZEXT416(puVar74[-4]));
                            bVar65 = ((byte)uVar24 | (byte)uVar25) & bVar66;
                            uVar60 = (uint)lVar63;
                            bVar76 = bVar66;
                            if (bVar65 != 0) {
                              auVar85 = vmulps_avx512vl(auVar95,auVar84);
                              auVar88 = vmulps_avx512vl(auVar92,auVar96);
                              auVar89 = vmulps_avx512vl(auVar94,auVar93);
                              auVar90 = vmulps_avx512vl(auVar97,auVar96);
                              auVar98 = vmulps_avx512vl(auVar94,auVar83);
                              auVar101 = vmulps_avx512vl(auVar99,auVar95);
                              auVar93 = vfmsub213ps_avx512vl(auVar93,auVar96,auVar85);
                              auVar84 = vfmsub213ps_avx512vl(auVar84,auVar94,auVar88);
                              auVar92 = vfmsub213ps_avx512vl(auVar92,auVar95,auVar89);
                              auVar83 = vfmsub213ps_avx512vl(auVar83,auVar95,auVar90);
                              auVar96 = vfmsub213ps_avx512vl(auVar99,auVar96,auVar98);
                              auVar94 = vfmsub213ps_avx512vl(auVar97,auVar94,auVar101);
                              vandps_avx512vl(auVar85,auVar91);
                              vandps_avx512vl(auVar90,auVar91);
                              uVar78 = vcmpps_avx512vl(auVar94,auVar94,1);
                              vandps_avx512vl(auVar88,auVar91);
                              vandps_avx512vl(auVar98,auVar91);
                              uVar64 = vcmpps_avx512vl(auVar94,auVar94,1);
                              vandps_avx512vl(auVar89,auVar91);
                              vandps_avx512vl(auVar101,auVar91);
                              uVar61 = vcmpps_avx512vl(auVar94,auVar94,1);
                              bVar77 = (bool)((byte)uVar78 & 1);
                              vVar102.field_0._0_4_ =
                                   (uint)bVar77 * auVar93._0_4_ | (uint)!bVar77 * auVar83._0_4_;
                              bVar77 = (bool)((byte)(uVar78 >> 1) & 1);
                              vVar102.field_0._4_4_ =
                                   (uint)bVar77 * auVar93._4_4_ | (uint)!bVar77 * auVar83._4_4_;
                              bVar77 = (bool)((byte)(uVar78 >> 2) & 1);
                              vVar102.field_0._8_4_ =
                                   (uint)bVar77 * auVar93._8_4_ | (uint)!bVar77 * auVar83._8_4_;
                              bVar77 = (bool)((byte)(uVar78 >> 3) & 1);
                              vVar102.field_0._12_4_ =
                                   (uint)bVar77 * auVar93._12_4_ | (uint)!bVar77 * auVar83._12_4_;
                              bVar77 = (bool)((byte)(uVar78 >> 4) & 1);
                              vVar102.field_0._16_4_ =
                                   (uint)bVar77 * auVar93._16_4_ | (uint)!bVar77 * auVar83._16_4_;
                              bVar77 = (bool)((byte)(uVar78 >> 5) & 1);
                              vVar102.field_0._20_4_ =
                                   (uint)bVar77 * auVar93._20_4_ | (uint)!bVar77 * auVar83._20_4_;
                              bVar77 = (bool)((byte)(uVar78 >> 6) & 1);
                              vVar102.field_0._24_4_ =
                                   (uint)bVar77 * auVar93._24_4_ | (uint)!bVar77 * auVar83._24_4_;
                              bVar77 = SUB81(uVar78 >> 7,0);
                              vVar102.field_0._28_4_ =
                                   (uint)bVar77 * auVar93._28_4_ | (uint)!bVar77 * auVar83._28_4_;
                              bVar77 = (bool)((byte)uVar64 & 1);
                              local_5de0._32_4_ =
                                   (uint)bVar77 * auVar84._0_4_ | (uint)!bVar77 * auVar96._0_4_;
                              bVar77 = (bool)((byte)(uVar64 >> 1) & 1);
                              local_5de0._36_4_ =
                                   (uint)bVar77 * auVar84._4_4_ | (uint)!bVar77 * auVar96._4_4_;
                              bVar77 = (bool)((byte)(uVar64 >> 2) & 1);
                              local_5de0._40_4_ =
                                   (uint)bVar77 * auVar84._8_4_ | (uint)!bVar77 * auVar96._8_4_;
                              bVar77 = (bool)((byte)(uVar64 >> 3) & 1);
                              local_5de0._44_4_ =
                                   (uint)bVar77 * auVar84._12_4_ | (uint)!bVar77 * auVar96._12_4_;
                              bVar77 = (bool)((byte)(uVar64 >> 4) & 1);
                              local_5de0._48_4_ =
                                   (uint)bVar77 * auVar84._16_4_ | (uint)!bVar77 * auVar96._16_4_;
                              bVar77 = (bool)((byte)(uVar64 >> 5) & 1);
                              local_5de0._52_4_ =
                                   (uint)bVar77 * auVar84._20_4_ | (uint)!bVar77 * auVar96._20_4_;
                              bVar77 = (bool)((byte)(uVar64 >> 6) & 1);
                              local_5de0._56_4_ =
                                   (uint)bVar77 * auVar84._24_4_ | (uint)!bVar77 * auVar96._24_4_;
                              bVar77 = SUB81(uVar64 >> 7,0);
                              local_5de0._60_4_ =
                                   (uint)bVar77 * auVar84._28_4_ | (uint)!bVar77 * auVar96._28_4_;
                              bVar77 = (bool)((byte)uVar61 & 1);
                              local_5de0._64_4_ =
                                   (uint)bVar77 * auVar92._0_4_ | (uint)!bVar77 * auVar94._0_4_;
                              bVar77 = (bool)((byte)(uVar61 >> 1) & 1);
                              fStack_5d9c = (float)((uint)bVar77 * auVar92._4_4_ |
                                                   (uint)!bVar77 * auVar94._4_4_);
                              bVar77 = (bool)((byte)(uVar61 >> 2) & 1);
                              fStack_5d98 = (float)((uint)bVar77 * auVar92._8_4_ |
                                                   (uint)!bVar77 * auVar94._8_4_);
                              bVar77 = (bool)((byte)(uVar61 >> 3) & 1);
                              fStack_5d94 = (float)((uint)bVar77 * auVar92._12_4_ |
                                                   (uint)!bVar77 * auVar94._12_4_);
                              bVar77 = (bool)((byte)(uVar61 >> 4) & 1);
                              fStack_5d90 = (float)((uint)bVar77 * auVar92._16_4_ |
                                                   (uint)!bVar77 * auVar94._16_4_);
                              bVar77 = (bool)((byte)(uVar61 >> 5) & 1);
                              fStack_5d8c = (float)((uint)bVar77 * auVar92._20_4_ |
                                                   (uint)!bVar77 * auVar94._20_4_);
                              bVar77 = (bool)((byte)(uVar61 >> 6) & 1);
                              fStack_5d88 = (float)((uint)bVar77 * auVar92._24_4_ |
                                                   (uint)!bVar77 * auVar94._24_4_);
                              bVar77 = SUB81(uVar61 >> 7,0);
                              uStack_5d84 = (uint)bVar77 * auVar92._28_4_ |
                                            (uint)!bVar77 * auVar94._28_4_;
                              auVar37._4_4_ = fVar108 * fStack_5d9c;
                              auVar37._0_4_ = fVar80 * (float)local_5de0._64_4_;
                              auVar37._8_4_ = fVar109 * fStack_5d98;
                              auVar37._12_4_ = fVar110 * fStack_5d94;
                              auVar37._16_4_ = fVar111 * fStack_5d90;
                              auVar37._20_4_ = fVar112 * fStack_5d8c;
                              auVar37._24_4_ = fVar113 * fStack_5d88;
                              auVar37._28_4_ = auVar159._28_4_;
                              auVar81 = vfmadd213ps_fma(auVar87,local_5de0._32_32_,auVar37);
                              auVar81 = vfmadd213ps_fma(auVar86,(undefined1  [32])vVar102.field_0,
                                                        ZEXT1632(auVar81));
                              auVar86 = ZEXT1632(CONCAT412(auVar81._12_4_ + auVar81._12_4_,
                                                           CONCAT48(auVar81._8_4_ + auVar81._8_4_,
                                                                    CONCAT44(auVar81._4_4_ +
                                                                             auVar81._4_4_,
                                                                             auVar81._0_4_ +
                                                                             auVar81._0_4_))));
                              in_ZMM9 = ZEXT3264(auVar86);
                              auVar148._0_4_ = auVar23._0_4_ * (float)local_5de0._64_4_;
                              auVar148._4_4_ = auVar23._4_4_ * fStack_5d9c;
                              auVar148._8_4_ = auVar23._8_4_ * fStack_5d98;
                              auVar148._12_4_ = auVar23._12_4_ * fStack_5d94;
                              auVar148._16_4_ = auVar23._16_4_ * fStack_5d90;
                              auVar148._20_4_ = auVar23._20_4_ * fStack_5d8c;
                              auVar148._24_4_ = auVar23._24_4_ * fStack_5d88;
                              auVar148._28_4_ = 0;
                              auVar81 = vfmadd213ps_fma(auVar22,local_5de0._32_32_,auVar148);
                              auVar82 = vfmadd213ps_fma(auVar107,(undefined1  [32])vVar102.field_0,
                                                        ZEXT1632(auVar81));
                              auVar83 = vrcp14ps_avx512vl(auVar86);
                              auVar84 = vxorps_avx512vl(auVar86,auVar157._0_32_);
                              auVar87 = auVar160._0_32_;
                              auVar85 = vfnmadd213ps_avx512vl(auVar83,auVar86,auVar87);
                              auVar81 = vfmadd132ps_fma(auVar85,auVar83,auVar83);
                              auVar130._0_4_ = auVar81._0_4_ * (auVar82._0_4_ + auVar82._0_4_);
                              auVar130._4_4_ = auVar81._4_4_ * (auVar82._4_4_ + auVar82._4_4_);
                              auVar130._8_4_ = auVar81._8_4_ * (auVar82._8_4_ + auVar82._8_4_);
                              auVar130._12_4_ = auVar81._12_4_ * (auVar82._12_4_ + auVar82._12_4_);
                              vVar38.field_0 =
                                   (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)ZEXT1632(auVar130)
                              ;
                              in_ZMM7 = ZEXT3264((undefined1  [32])vVar38.field_0);
                              uVar24 = vcmpps_avx512vl((undefined1  [32])vVar38.field_0,
                                                       *(undefined1 (*) [32])(ray + 0x100),2);
                              uVar25 = vcmpps_avx512vl((undefined1  [32])vVar38.field_0,
                                                       *(undefined1 (*) [32])(ray + 0x60),0xd);
                              uVar26 = vcmpps_avx512vl(auVar86,auVar84,4);
                              bVar65 = bVar65 & (byte)uVar24 & (byte)uVar25 & (byte)uVar26;
                              if (bVar65 != 0) {
                                uVar64 = CONCAT44(0,*(uint *)((long)&local_5e10 + lVar63 * 4));
                                pGVar11 = (context->scene->geometries).items[uVar64].ptr;
                                local_5ec0._0_8_ = pGVar11;
                                uVar4 = pGVar11->mask;
                                auVar134._4_4_ = uVar4;
                                auVar134._0_4_ = uVar4;
                                auVar134._8_4_ = uVar4;
                                auVar134._12_4_ = uVar4;
                                auVar134._16_4_ = uVar4;
                                auVar134._20_4_ = uVar4;
                                auVar134._24_4_ = uVar4;
                                auVar134._28_4_ = uVar4;
                                uVar24 = vptestmd_avx512vl(auVar134,*(undefined1 (*) [32])
                                                                     (ray + 0x120));
                                bVar75 = (byte)uVar24 & bVar65;
                                uVar78 = (ulong)bVar75;
                                if (bVar75 != 0) {
                                  local_5e00._0_8_ = uVar64;
                                  local_5edc = *(undefined4 *)((long)&local_5e20 + lVar63 * 4);
                                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                     (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                    auVar81 = vcvtsi2ss_avx512f(auVar95._0_16_,
                                                                *(ushort *)(lVar12 + 8 + lVar62) - 1
                                                               );
                                    auVar47._12_4_ = 0;
                                    auVar47._0_12_ = ZEXT812(0);
                                    auVar82 = vrcp14ss_avx512f(auVar47 << 0x20,
                                                               ZEXT416(auVar81._0_4_));
                                    auVar81 = vfnmadd213ss_fma(auVar81,auVar82,
                                                               SUB6416(ZEXT464(0x40000000),0));
                                    fVar80 = auVar82._0_4_ * auVar81._0_4_;
                                    auVar139._0_4_ =
                                         (float)(int)(*(ushort *)(lVar12 + 10 + lVar62) - 1);
                                    auVar139._4_12_ = auVar115._4_12_;
                                    fVar108 = (float)(int)((uVar60 & 1) + local_5f24);
                                    auVar150._0_4_ = fVar108 * auVar100._0_4_ + fVar114;
                                    auVar150._4_4_ = fVar108 * auVar100._4_4_ + fVar118;
                                    auVar150._8_4_ = fVar108 * auVar100._8_4_ + fVar119;
                                    auVar150._12_4_ = fVar108 * auVar100._12_4_ + fVar79;
                                    auVar150._16_4_ = fVar108 * auVar100._16_4_ + 0.0;
                                    auVar150._20_4_ = fVar108 * auVar100._20_4_ + 0.0;
                                    auVar150._24_4_ = fVar108 * auVar100._24_4_ + 0.0;
                                    auVar150._28_4_ = fVar108 + 0.0;
                                    auVar135._4_4_ = fVar80;
                                    auVar135._0_4_ = fVar80;
                                    auVar135._8_4_ = fVar80;
                                    auVar135._12_4_ = fVar80;
                                    auVar135._16_4_ = fVar80;
                                    auVar135._20_4_ = fVar80;
                                    auVar135._24_4_ = fVar80;
                                    auVar135._28_4_ = fVar80;
                                    auVar83 = vmulps_avx512vl(auVar150,auVar135);
                                    bVar77 = (bool)(bVar65 >> 1 & 1);
                                    bVar16 = (bool)(bVar65 >> 2 & 1);
                                    bVar18 = (bool)(bVar65 >> 3 & 1);
                                    auVar81 = vrcp14ss_avx512f(auVar47 << 0x20,
                                                               ZEXT416((uint)auVar139._0_4_));
                                    auVar115 = vfnmadd213ss_fma(auVar139,auVar81,
                                                                SUB6416(ZEXT464(0x40000000),0));
                                    fVar108 = (float)(int)((uVar60 >> 1) + local_5f28);
                                    fVar80 = auVar81._0_4_ * auVar115._0_4_;
                                    auVar140._0_4_ = fVar108 * auVar100._0_4_ + fVar153;
                                    auVar140._4_4_ = fVar108 * auVar100._4_4_ + fVar147;
                                    auVar140._8_4_ = fVar108 * auVar100._8_4_ + fVar154;
                                    auVar140._12_4_ = fVar108 * auVar100._12_4_ + fVar155;
                                    auVar144._16_4_ = fVar108 * auVar100._16_4_ + 0.0;
                                    auVar144._0_16_ = auVar140;
                                    auVar144._20_4_ = fVar108 * auVar100._20_4_ + 0.0;
                                    auVar144._24_4_ = fVar108 * auVar100._24_4_ + 0.0;
                                    auVar144._28_4_ = fVar108 + 0.0;
                                    auVar136._4_4_ = fVar80;
                                    auVar136._0_4_ = fVar80;
                                    auVar136._8_4_ = fVar80;
                                    auVar136._12_4_ = fVar80;
                                    auVar136._16_4_ = fVar80;
                                    auVar136._20_4_ = fVar80;
                                    auVar136._24_4_ = fVar80;
                                    auVar136._28_4_ = fVar80;
                                    auVar84 = vmulps_avx512vl(auVar144,auVar136);
                                    bVar15 = (bool)(bVar65 >> 1 & 1);
                                    bVar17 = (bool)(bVar65 >> 2 & 1);
                                    bVar19 = (bool)(bVar65 >> 3 & 1);
                                    auVar29._8_4_ = 0x219392ef;
                                    auVar29._0_8_ = 0x219392ef219392ef;
                                    auVar29._12_4_ = 0x219392ef;
                                    auVar29._16_4_ = 0x219392ef;
                                    auVar29._20_4_ = 0x219392ef;
                                    auVar29._24_4_ = 0x219392ef;
                                    auVar29._28_4_ = 0x219392ef;
                                    uVar64 = vcmpps_avx512vl(auVar100,auVar29,5);
                                    auVar85 = vrcp14ps_avx512vl(auVar100);
                                    auVar86 = vfnmadd213ps_avx512vl(auVar100,auVar85,auVar87);
                                    auVar85 = vfmadd132ps_avx512vl(auVar86,auVar85,auVar85);
                                    fVar113 = (float)((uint)((byte)uVar64 & 1) * auVar85._0_4_);
                                    fVar80 = (float)((uint)((byte)(uVar64 >> 1) & 1) * auVar85._4_4_
                                                    );
                                    fVar112 = (float)((uint)((byte)(uVar64 >> 2) & 1) *
                                                     auVar85._8_4_);
                                    fVar111 = (float)((uint)((byte)(uVar64 >> 3) & 1) *
                                                     auVar85._12_4_);
                                    fVar110 = (float)((uint)((byte)(uVar64 >> 4) & 1) *
                                                     auVar85._16_4_);
                                    fVar109 = (float)((uint)((byte)(uVar64 >> 5) & 1) *
                                                     auVar85._20_4_);
                                    fVar108 = (float)((uint)((byte)(uVar64 >> 6) & 1) *
                                                     auVar85._24_4_);
                                    auVar43._4_4_ =
                                         (float)((uint)bVar77 * auVar83._4_4_ |
                                                (uint)!bVar77 * (int)fVar118) * fVar80;
                                    auVar43._0_4_ =
                                         (float)((uint)(bVar65 & 1) * auVar83._0_4_ |
                                                (uint)!(bool)(bVar65 & 1) * (int)fVar114) * fVar113;
                                    auVar43._8_4_ =
                                         (float)((uint)bVar16 * auVar83._8_4_ |
                                                (uint)!bVar16 * (int)fVar119) * fVar112;
                                    auVar43._12_4_ =
                                         (float)((uint)bVar18 * auVar83._12_4_ |
                                                (uint)!bVar18 * (int)fVar79) * fVar111;
                                    auVar43._16_4_ =
                                         (float)((uint)(bVar65 >> 4 & 1) * auVar83._16_4_) * fVar110
                                    ;
                                    auVar43._20_4_ =
                                         (float)((uint)(bVar65 >> 5 & 1) * auVar83._20_4_) * fVar109
                                    ;
                                    auVar43._24_4_ =
                                         (float)((uint)(bVar65 >> 6 & 1) * auVar83._24_4_) * fVar108
                                    ;
                                    auVar43._28_4_ = (uint)(bVar65 >> 7) * auVar83._28_4_;
                                    local_5d40 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                                                 vminps_avx512vl(auVar43,auVar87);
                                    auVar44._4_4_ =
                                         (float)((uint)bVar15 * auVar84._4_4_ |
                                                (uint)!bVar15 * (int)fVar147) * fVar80;
                                    auVar44._0_4_ =
                                         (float)((uint)(bVar65 & 1) * auVar84._0_4_ |
                                                (uint)!(bool)(bVar65 & 1) * (int)fVar153) * fVar113;
                                    auVar44._8_4_ =
                                         (float)((uint)bVar17 * auVar84._8_4_ |
                                                (uint)!bVar17 * (int)fVar154) * fVar112;
                                    auVar44._12_4_ =
                                         (float)((uint)bVar19 * auVar84._12_4_ |
                                                (uint)!bVar19 * (int)fVar155) * fVar111;
                                    auVar44._16_4_ =
                                         (float)((uint)(bVar65 >> 4 & 1) * auVar84._16_4_) * fVar110
                                    ;
                                    auVar44._20_4_ =
                                         (float)((uint)(bVar65 >> 5 & 1) * auVar84._20_4_) * fVar109
                                    ;
                                    auVar44._24_4_ =
                                         (float)((uint)(bVar65 >> 6 & 1) * auVar84._24_4_) * fVar108
                                    ;
                                    auVar44._28_4_ = (uint)(bVar65 >> 7) * auVar84._28_4_;
                                    local_5d60 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                                                 vminps_avx512vl(auVar44,auVar87);
                                    local_5f20.geometryUserPtr = local_5ca0;
                                    local_5f20.valid = (int *)local_5c40;
                                    local_5f20.context = (RTCRayQueryContext *)&local_5c80;
                                    local_5f20.ray = (RTCRayN *)&local_5e40;
                                    auVar129 = ZEXT1664(CONCAT412(fVar111,CONCAT48(fVar112,CONCAT44(
                                                  fVar80,fVar113))));
                                    in_ZMM7 = ZEXT1664(auVar130);
                                    in_ZMM9 = ZEXT1664(auVar140);
                                    local_5de0._0_32_ = (undefined1  [32])vVar102.field_0;
                                    local_5d80 = vVar38.field_0;
                                    std::
                                    _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
                                    ::
                                    _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                                              ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                                                *)&local_5f20,
                                               (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                                                *)local_5de0);
                                    pRVar14 = context->user;
                                    local_5d20 = vpbroadcastd_avx512vl();
                                    local_5d40 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                                                 vpbroadcastd_avx512vl();
                                    local_5de0._0_32_ = (undefined1  [32])local_5c40[0];
                                    local_5d80 = local_5e40;
                                    local_5d60 = local_5c80;
                                    auVar83 = vpcmpeqd_avx2(local_5d20,local_5d20);
                                    local_5ed8[1] = auVar83;
                                    *local_5ed8 = auVar83;
                                    local_5d00 = pRVar14->instID[0];
                                    uStack_5cfc = local_5d00;
                                    uStack_5cf8 = local_5d00;
                                    uStack_5cf4 = local_5d00;
                                    uStack_5cf0 = local_5d00;
                                    uStack_5cec = local_5d00;
                                    uStack_5ce8 = local_5d00;
                                    uStack_5ce4 = local_5d00;
                                    local_5ce0 = pRVar14->instPrimID[0];
                                    uStack_5cdc = local_5ce0;
                                    uStack_5cd8 = local_5ce0;
                                    uStack_5cd4 = local_5ce0;
                                    uStack_5cd0 = local_5ce0;
                                    uStack_5ccc = local_5ce0;
                                    uStack_5cc8 = local_5ce0;
                                    uStack_5cc4 = local_5ce0;
                                    local_5e00 = *(undefined1 (*) [32])(ray + 0x100);
                                    auVar83 = vblendmps_avx512vl(local_5e00,local_5ca0);
                                    bVar77 = (bool)(bVar75 >> 1 & 1);
                                    bVar15 = (bool)(bVar75 >> 2 & 1);
                                    bVar16 = (bool)(bVar75 >> 3 & 1);
                                    bVar17 = (bool)(bVar75 >> 4 & 1);
                                    bVar18 = (bool)(bVar75 >> 5 & 1);
                                    bVar19 = (bool)(bVar75 >> 6 & 1);
                                    *(uint *)(ray + 0x100) =
                                         (uint)(bVar75 & 1) * auVar83._0_4_ |
                                         !(bool)(bVar75 & 1) * local_5ce0;
                                    *(uint *)(ray + 0x104) =
                                         (uint)bVar77 * auVar83._4_4_ | !bVar77 * local_5ce0;
                                    *(uint *)(ray + 0x108) =
                                         (uint)bVar15 * auVar83._8_4_ | !bVar15 * local_5ce0;
                                    *(uint *)(ray + 0x10c) =
                                         (uint)bVar16 * auVar83._12_4_ | !bVar16 * local_5ce0;
                                    *(uint *)(ray + 0x110) =
                                         (uint)bVar17 * auVar83._16_4_ | !bVar17 * local_5ce0;
                                    *(uint *)(ray + 0x114) =
                                         (uint)bVar18 * auVar83._20_4_ | !bVar18 * local_5ce0;
                                    *(uint *)(ray + 0x118) =
                                         (uint)bVar19 * auVar83._24_4_ | !bVar19 * local_5ce0;
                                    *(uint *)(ray + 0x11c) =
                                         (uint)(bVar75 >> 7) * auVar83._28_4_ |
                                         !(bool)(bVar75 >> 7) * local_5ce0;
                                    local_5ea0 = vpmovm2d_avx512vl(uVar78);
                                    local_5f20.geometryUserPtr =
                                         (void *)*(undefined8 *)(local_5ec0._0_8_ + 0x18);
                                    local_5f20.valid = (int *)local_5ea0;
                                    local_5f20.context = context->user;
                                    local_5f20.ray = (RTCRayN *)ray;
                                    local_5f20.hit = (RTCHitN *)local_5de0;
                                    local_5f20.N = 8;
                                    if (*(code **)(local_5ec0._0_8_ + 0x48) != (code *)0x0) {
                                      auVar129 = ZEXT1664(auVar129._0_16_);
                                      in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
                                      in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                                      (**(code **)(local_5ec0._0_8_ + 0x48))(&local_5f20);
                                    }
                                    if (local_5ea0 == (undefined1  [32])0x0) {
                                      uVar78 = 0;
                                      auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                      auVar158 = ZEXT3264(auVar83);
                                      auVar83 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                      auVar160 = ZEXT3264(auVar83);
                                      auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                      auVar161 = ZEXT3264(auVar83);
                                      auVar83 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                      auVar162 = ZEXT3264(auVar83);
                                      auVar83 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                      auVar163 = ZEXT3264(auVar83);
                                      auVar83 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                                      auVar164 = ZEXT3264(auVar83);
                                    }
                                    else {
                                      p_Var13 = context->args->filter;
                                      if (p_Var13 == (RTCFilterFunctionN)0x0) {
                                        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                        auVar158 = ZEXT3264(auVar83);
                                        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                        auVar160 = ZEXT3264(auVar83);
                                        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                        auVar161 = ZEXT3264(auVar83);
                                        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                        auVar162 = ZEXT3264(auVar83);
                                        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                        auVar163 = ZEXT3264(auVar83);
                                        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                                        auVar164 = ZEXT3264(auVar83);
                                      }
                                      else {
                                        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                        auVar158 = ZEXT3264(auVar83);
                                        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                        auVar160 = ZEXT3264(auVar83);
                                        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                        auVar161 = ZEXT3264(auVar83);
                                        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                        auVar162 = ZEXT3264(auVar83);
                                        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                        auVar163 = ZEXT3264(auVar83);
                                        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                                        auVar164 = ZEXT3264(auVar83);
                                        if (((context->args->flags &
                                             RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                           ((*(byte *)(local_5ec0._0_8_ + 0x3e) & 0x40) != 0)) {
                                          auVar129 = ZEXT1664(auVar129._0_16_);
                                          in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
                                          in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                                          (*p_Var13)(&local_5f20);
                                          auVar83 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                                          auVar164 = ZEXT3264(auVar83);
                                          auVar83 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                          auVar163 = ZEXT3264(auVar83);
                                          auVar83 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                          auVar162 = ZEXT3264(auVar83);
                                          auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                          auVar161 = ZEXT3264(auVar83);
                                          auVar83 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                          auVar160 = ZEXT3264(auVar83);
                                          auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                          auVar158 = ZEXT3264(auVar83);
                                        }
                                      }
                                      uVar78 = vptestmd_avx512vl(local_5ea0,local_5ea0);
                                      iVar59 = *(int *)(local_5f20.ray + 0x104);
                                      iVar49 = *(int *)(local_5f20.ray + 0x108);
                                      iVar50 = *(int *)(local_5f20.ray + 0x10c);
                                      iVar51 = *(int *)(local_5f20.ray + 0x110);
                                      iVar52 = *(int *)(local_5f20.ray + 0x114);
                                      iVar53 = *(int *)(local_5f20.ray + 0x118);
                                      iVar54 = *(int *)(local_5f20.ray + 0x11c);
                                      auVar83 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                      bVar77 = (bool)((byte)uVar78 & 1);
                                      bVar15 = (bool)((byte)(uVar78 >> 1) & 1);
                                      bVar16 = (bool)((byte)(uVar78 >> 2) & 1);
                                      bVar17 = (bool)((byte)(uVar78 >> 3) & 1);
                                      bVar18 = (bool)((byte)(uVar78 >> 4) & 1);
                                      bVar19 = (bool)((byte)(uVar78 >> 5) & 1);
                                      bVar20 = (bool)((byte)(uVar78 >> 6) & 1);
                                      bVar21 = SUB81(uVar78 >> 7,0);
                                      *(uint *)&local_5f20.ray[0x100].field_0x0 =
                                           (uint)bVar77 * auVar83._0_4_ |
                                           (uint)!bVar77 * *(int *)&local_5f20.ray[0x100].field_0x0;
                                      *(uint *)(local_5f20.ray + 0x104) =
                                           (uint)bVar15 * auVar83._4_4_ | (uint)!bVar15 * iVar59;
                                      *(uint *)(local_5f20.ray + 0x108) =
                                           (uint)bVar16 * auVar83._8_4_ | (uint)!bVar16 * iVar49;
                                      *(uint *)(local_5f20.ray + 0x10c) =
                                           (uint)bVar17 * auVar83._12_4_ | (uint)!bVar17 * iVar50;
                                      *(uint *)(local_5f20.ray + 0x110) =
                                           (uint)bVar18 * auVar83._16_4_ | (uint)!bVar18 * iVar51;
                                      *(uint *)(local_5f20.ray + 0x114) =
                                           (uint)bVar19 * auVar83._20_4_ | (uint)!bVar19 * iVar52;
                                      *(uint *)(local_5f20.ray + 0x118) =
                                           (uint)bVar20 * auVar83._24_4_ | (uint)!bVar20 * iVar53;
                                      *(uint *)(local_5f20.ray + 0x11c) =
                                           (uint)bVar21 * auVar83._28_4_ | (uint)!bVar21 * iVar54;
                                    }
                                    bVar77 = (bool)((byte)uVar78 & 1);
                                    bVar15 = (bool)((byte)(uVar78 >> 1) & 1);
                                    bVar16 = (bool)((byte)(uVar78 >> 2) & 1);
                                    bVar17 = (bool)((byte)(uVar78 >> 3) & 1);
                                    bVar18 = (bool)((byte)(uVar78 >> 4) & 1);
                                    bVar19 = (bool)((byte)(uVar78 >> 5) & 1);
                                    bVar20 = (bool)((byte)(uVar78 >> 6) & 1);
                                    bVar21 = SUB81(uVar78 >> 7,0);
                                    *(uint *)local_5ef0 =
                                         (uint)bVar77 * *(int *)local_5ef0 |
                                         (uint)!bVar77 * local_5e00._0_4_;
                                    *(uint *)(local_5ef0 + 4) =
                                         (uint)bVar15 * *(int *)(local_5ef0 + 4) |
                                         (uint)!bVar15 * local_5e00._4_4_;
                                    *(uint *)(local_5ef0 + 8) =
                                         (uint)bVar16 * *(int *)(local_5ef0 + 8) |
                                         (uint)!bVar16 * local_5e00._8_4_;
                                    *(uint *)(local_5ef0 + 0xc) =
                                         (uint)bVar17 * *(int *)(local_5ef0 + 0xc) |
                                         (uint)!bVar17 * local_5e00._12_4_;
                                    *(uint *)(local_5ef0 + 0x10) =
                                         (uint)bVar18 * *(int *)(local_5ef0 + 0x10) |
                                         (uint)!bVar18 * local_5e00._16_4_;
                                    *(uint *)(local_5ef0 + 0x14) =
                                         (uint)bVar19 * *(int *)(local_5ef0 + 0x14) |
                                         (uint)!bVar19 * local_5e00._20_4_;
                                    *(uint *)(local_5ef0 + 0x18) =
                                         (uint)bVar20 * *(int *)(local_5ef0 + 0x18) |
                                         (uint)!bVar20 * local_5e00._24_4_;
                                    *(uint *)(local_5ef0 + 0x1c) =
                                         (uint)bVar21 * *(int *)(local_5ef0 + 0x1c) |
                                         (uint)!bVar21 * local_5e00._28_4_;
                                  }
                                  bVar76 = ~(byte)uVar78 & bVar66;
                                }
                                bVar66 = bVar65 ^ bVar66;
                              }
                            }
                            if (bVar66 == 0) {
                              auVar83 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                              auVar157 = ZEXT3264(auVar83);
                              bVar66 = bVar76;
                            }
                            else {
                              auVar83 = *(undefined1 (*) [32])ray;
                              auVar84 = *(undefined1 (*) [32])(ray + 0x20);
                              auVar85 = *(undefined1 (*) [32])(ray + 0x40);
                              auVar86 = *(undefined1 (*) [32])(ray + 0x80);
                              auVar87 = *(undefined1 (*) [32])(ray + 0xa0);
                              auVar159 = *(undefined1 (*) [32])(ray + 0xc0);
                              auVar107 = vsubps_avx(local_58e0,auVar83);
                              auVar22 = vsubps_avx(local_5900,auVar84);
                              in_ZMM7 = ZEXT3264(auVar22);
                              auVar23 = vsubps_avx(local_5920,auVar85);
                              auVar100 = vsubps_avx(local_5880,auVar83);
                              auVar88 = vsubps_avx(local_58a0,auVar84);
                              auVar89 = vsubps_avx512vl(local_58c0,auVar85);
                              auVar83 = vsubps_avx512vl(local_5cc0,auVar83);
                              auVar84 = vsubps_avx512vl(local_5840,auVar84);
                              auVar85 = vsubps_avx512vl(local_5860,auVar85);
                              auVar90 = vsubps_avx512vl(auVar83,auVar107);
                              auVar91 = vsubps_avx512vl(auVar84,auVar22);
                              auVar92 = vsubps_avx512vl(auVar85,auVar23);
                              auVar93 = vsubps_avx512vl(auVar107,auVar100);
                              auVar94 = vsubps_avx512vl(auVar22,auVar88);
                              auVar95 = vsubps_avx512vl(auVar23,auVar89);
                              auVar96 = vsubps_avx512vl(auVar100,auVar83);
                              auVar97 = vsubps_avx512vl(auVar88,auVar84);
                              auVar98 = vsubps_avx512vl(auVar89,auVar85);
                              auVar99 = vaddps_avx512vl(auVar83,auVar107);
                              auVar101 = vaddps_avx512vl(auVar84,auVar22);
                              auVar103 = vaddps_avx512vl(auVar85,auVar23);
                              auVar104 = vmulps_avx512vl(auVar101,auVar92);
                              auVar104 = vfmsub231ps_avx512vl(auVar104,auVar91,auVar103);
                              auVar103 = vmulps_avx512vl(auVar103,auVar90);
                              auVar103 = vfmsub231ps_avx512vl(auVar103,auVar92,auVar99);
                              auVar39._4_4_ = auVar91._4_4_ * auVar99._4_4_;
                              auVar39._0_4_ = auVar91._0_4_ * auVar99._0_4_;
                              auVar39._8_4_ = auVar91._8_4_ * auVar99._8_4_;
                              auVar39._12_4_ = auVar91._12_4_ * auVar99._12_4_;
                              auVar39._16_4_ = auVar91._16_4_ * auVar99._16_4_;
                              auVar39._20_4_ = auVar91._20_4_ * auVar99._20_4_;
                              auVar39._24_4_ = auVar91._24_4_ * auVar99._24_4_;
                              auVar39._28_4_ = auVar99._28_4_;
                              auVar115 = vfmsub231ps_fma(auVar39,auVar90,auVar101);
                              fVar153 = auVar159._0_4_;
                              auVar128._0_4_ = fVar153 * auVar115._0_4_;
                              fVar147 = auVar159._4_4_;
                              auVar128._4_4_ = fVar147 * auVar115._4_4_;
                              fVar154 = auVar159._8_4_;
                              auVar128._8_4_ = fVar154 * auVar115._8_4_;
                              fVar155 = auVar159._12_4_;
                              auVar128._12_4_ = fVar155 * auVar115._12_4_;
                              fVar114 = auVar159._16_4_;
                              auVar128._16_4_ = fVar114 * 0.0;
                              fVar118 = auVar159._20_4_;
                              auVar128._20_4_ = fVar118 * 0.0;
                              fVar119 = auVar159._24_4_;
                              auVar128._24_4_ = fVar119 * 0.0;
                              auVar128._28_4_ = 0;
                              auVar99 = vfmadd231ps_avx512vl(auVar128,auVar87,auVar103);
                              auVar99 = vfmadd231ps_avx512vl(auVar99,auVar86,auVar104);
                              auVar129 = ZEXT3264(auVar99);
                              auVar143._0_4_ = auVar107._0_4_ + auVar100._0_4_;
                              auVar143._4_4_ = auVar107._4_4_ + auVar100._4_4_;
                              auVar143._8_4_ = auVar107._8_4_ + auVar100._8_4_;
                              auVar143._12_4_ = auVar107._12_4_ + auVar100._12_4_;
                              auVar143._16_4_ = auVar107._16_4_ + auVar100._16_4_;
                              auVar143._20_4_ = auVar107._20_4_ + auVar100._20_4_;
                              auVar143._24_4_ = auVar107._24_4_ + auVar100._24_4_;
                              auVar143._28_4_ = auVar107._28_4_ + auVar100._28_4_;
                              auVar101 = vaddps_avx512vl(auVar22,auVar88);
                              auVar103 = vaddps_avx512vl(auVar23,auVar89);
                              auVar104 = vmulps_avx512vl(auVar101,auVar95);
                              auVar104 = vfmsub231ps_avx512vl(auVar104,auVar94,auVar103);
                              auVar103 = vmulps_avx512vl(auVar103,auVar93);
                              auVar103 = vfmsub231ps_avx512vl(auVar103,auVar95,auVar143);
                              auVar105 = vmulps_avx512vl(auVar143,auVar94);
                              auVar101 = vfmsub231ps_avx512vl(auVar105,auVar93,auVar101);
                              auVar40._4_4_ = auVar101._4_4_ * fVar147;
                              auVar40._0_4_ = auVar101._0_4_ * fVar153;
                              auVar40._8_4_ = auVar101._8_4_ * fVar154;
                              auVar40._12_4_ = auVar101._12_4_ * fVar155;
                              auVar40._16_4_ = auVar101._16_4_ * fVar114;
                              auVar40._20_4_ = auVar101._20_4_ * fVar118;
                              auVar40._24_4_ = auVar101._24_4_ * fVar119;
                              auVar40._28_4_ = auVar101._28_4_;
                              auVar101 = vfmadd231ps_avx512vl(auVar40,auVar87,auVar103);
                              auVar101 = vfmadd231ps_avx512vl(auVar101,auVar86,auVar104);
                              in_ZMM9 = ZEXT3264(auVar101);
                              auVar83 = vaddps_avx512vl(auVar100,auVar83);
                              auVar84 = vaddps_avx512vl(auVar88,auVar84);
                              auVar85 = vaddps_avx512vl(auVar89,auVar85);
                              auVar100 = vmulps_avx512vl(auVar84,auVar98);
                              auVar100 = vfmsub231ps_avx512vl(auVar100,auVar97,auVar85);
                              auVar85 = vmulps_avx512vl(auVar85,auVar96);
                              auVar85 = vfmsub231ps_avx512vl(auVar85,auVar98,auVar83);
                              auVar41._4_4_ = auVar83._4_4_ * auVar97._4_4_;
                              auVar41._0_4_ = auVar83._0_4_ * auVar97._0_4_;
                              auVar41._8_4_ = auVar83._8_4_ * auVar97._8_4_;
                              auVar41._12_4_ = auVar83._12_4_ * auVar97._12_4_;
                              auVar41._16_4_ = auVar83._16_4_ * auVar97._16_4_;
                              auVar41._20_4_ = auVar83._20_4_ * auVar97._20_4_;
                              auVar41._24_4_ = auVar83._24_4_ * auVar97._24_4_;
                              auVar41._28_4_ = auVar83._28_4_;
                              auVar115 = vfmsub231ps_fma(auVar41,auVar96,auVar84);
                              auVar83 = vmulps_avx512vl(ZEXT1632(auVar115),auVar159);
                              auVar83 = vfmadd231ps_avx512vl(auVar83,auVar87,auVar85);
                              auVar83 = vfmadd231ps_avx512vl(auVar83,auVar86,auVar100);
                              auVar124._0_4_ = auVar101._0_4_ + auVar99._0_4_;
                              auVar124._4_4_ = auVar101._4_4_ + auVar99._4_4_;
                              auVar124._8_4_ = auVar101._8_4_ + auVar99._8_4_;
                              auVar124._12_4_ = auVar101._12_4_ + auVar99._12_4_;
                              auVar124._16_4_ = auVar101._16_4_ + auVar99._16_4_;
                              auVar124._20_4_ = auVar101._20_4_ + auVar99._20_4_;
                              auVar124._24_4_ = auVar101._24_4_ + auVar99._24_4_;
                              auVar124._28_4_ = auVar101._28_4_ + auVar99._28_4_;
                              auVar84 = vaddps_avx512vl(auVar83,auVar124);
                              auVar103 = auVar158._0_32_;
                              vandps_avx512vl(auVar84,auVar103);
                              auVar85 = vmulps_avx512vl(auVar84,auVar164._0_32_);
                              auVar100 = vminps_avx512vl(auVar99,auVar101);
                              auVar100 = vminps_avx512vl(auVar100,auVar83);
                              auVar88 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                              auVar157 = ZEXT3264(auVar88);
                              auVar89 = vxorps_avx512vl(auVar85,auVar88);
                              uVar24 = vcmpps_avx512vl(auVar100,auVar89,5);
                              auVar100 = vmaxps_avx512vl(auVar99,auVar101);
                              auVar83 = vmaxps_avx512vl(auVar100,auVar83);
                              uVar25 = vcmpps_avx512vl(auVar83,auVar85,2);
                              bVar65 = ((byte)uVar24 | (byte)uVar25) & bVar76;
                              bVar66 = bVar76;
                              if (bVar65 != 0) {
                                auVar83 = vmulps_avx512vl(auVar94,auVar92);
                                auVar85 = vmulps_avx512vl(auVar90,auVar95);
                                auVar100 = vmulps_avx512vl(auVar93,auVar91);
                                auVar89 = vmulps_avx512vl(auVar97,auVar95);
                                auVar104 = vmulps_avx512vl(auVar93,auVar98);
                                auVar105 = vmulps_avx512vl(auVar96,auVar94);
                                auVar91 = vfmsub213ps_avx512vl(auVar91,auVar95,auVar83);
                                auVar92 = vfmsub213ps_avx512vl(auVar92,auVar93,auVar85);
                                auVar90 = vfmsub213ps_avx512vl(auVar90,auVar94,auVar100);
                                auVar98 = vfmsub213ps_avx512vl(auVar98,auVar94,auVar89);
                                auVar95 = vfmsub213ps_avx512vl(auVar96,auVar95,auVar104);
                                auVar93 = vfmsub213ps_avx512vl(auVar97,auVar93,auVar105);
                                vandps_avx512vl(auVar83,auVar103);
                                vandps_avx512vl(auVar89,auVar103);
                                uVar78 = vcmpps_avx512vl(auVar93,auVar93,1);
                                vandps_avx512vl(auVar85,auVar103);
                                vandps_avx512vl(auVar104,auVar103);
                                uVar64 = vcmpps_avx512vl(auVar93,auVar93,1);
                                vandps_avx512vl(auVar100,auVar103);
                                vandps_avx512vl(auVar105,auVar103);
                                uVar61 = vcmpps_avx512vl(auVar93,auVar93,1);
                                bVar77 = (bool)((byte)uVar78 & 1);
                                vVar106.field_0._0_4_ =
                                     (uint)bVar77 * auVar91._0_4_ | (uint)!bVar77 * auVar98._0_4_;
                                bVar77 = (bool)((byte)(uVar78 >> 1) & 1);
                                vVar106.field_0._4_4_ =
                                     (uint)bVar77 * auVar91._4_4_ | (uint)!bVar77 * auVar98._4_4_;
                                bVar77 = (bool)((byte)(uVar78 >> 2) & 1);
                                vVar106.field_0._8_4_ =
                                     (uint)bVar77 * auVar91._8_4_ | (uint)!bVar77 * auVar98._8_4_;
                                bVar77 = (bool)((byte)(uVar78 >> 3) & 1);
                                vVar106.field_0._12_4_ =
                                     (uint)bVar77 * auVar91._12_4_ | (uint)!bVar77 * auVar98._12_4_;
                                bVar77 = (bool)((byte)(uVar78 >> 4) & 1);
                                vVar106.field_0._16_4_ =
                                     (uint)bVar77 * auVar91._16_4_ | (uint)!bVar77 * auVar98._16_4_;
                                bVar77 = (bool)((byte)(uVar78 >> 5) & 1);
                                vVar106.field_0._20_4_ =
                                     (uint)bVar77 * auVar91._20_4_ | (uint)!bVar77 * auVar98._20_4_;
                                bVar77 = (bool)((byte)(uVar78 >> 6) & 1);
                                vVar106.field_0._24_4_ =
                                     (uint)bVar77 * auVar91._24_4_ | (uint)!bVar77 * auVar98._24_4_;
                                bVar77 = SUB81(uVar78 >> 7,0);
                                vVar106.field_0._28_4_ =
                                     (uint)bVar77 * auVar91._28_4_ | (uint)!bVar77 * auVar98._28_4_;
                                bVar77 = (bool)((byte)uVar64 & 1);
                                local_5de0._32_4_ =
                                     (uint)bVar77 * auVar92._0_4_ | (uint)!bVar77 * auVar95._0_4_;
                                bVar77 = (bool)((byte)(uVar64 >> 1) & 1);
                                local_5de0._36_4_ =
                                     (uint)bVar77 * auVar92._4_4_ | (uint)!bVar77 * auVar95._4_4_;
                                bVar77 = (bool)((byte)(uVar64 >> 2) & 1);
                                local_5de0._40_4_ =
                                     (uint)bVar77 * auVar92._8_4_ | (uint)!bVar77 * auVar95._8_4_;
                                bVar77 = (bool)((byte)(uVar64 >> 3) & 1);
                                local_5de0._44_4_ =
                                     (uint)bVar77 * auVar92._12_4_ | (uint)!bVar77 * auVar95._12_4_;
                                bVar77 = (bool)((byte)(uVar64 >> 4) & 1);
                                local_5de0._48_4_ =
                                     (uint)bVar77 * auVar92._16_4_ | (uint)!bVar77 * auVar95._16_4_;
                                bVar77 = (bool)((byte)(uVar64 >> 5) & 1);
                                local_5de0._52_4_ =
                                     (uint)bVar77 * auVar92._20_4_ | (uint)!bVar77 * auVar95._20_4_;
                                bVar77 = (bool)((byte)(uVar64 >> 6) & 1);
                                local_5de0._56_4_ =
                                     (uint)bVar77 * auVar92._24_4_ | (uint)!bVar77 * auVar95._24_4_;
                                bVar77 = SUB81(uVar64 >> 7,0);
                                local_5de0._60_4_ =
                                     (uint)bVar77 * auVar92._28_4_ | (uint)!bVar77 * auVar95._28_4_;
                                bVar77 = (bool)((byte)uVar61 & 1);
                                local_5de0._64_4_ =
                                     (uint)bVar77 * auVar90._0_4_ | (uint)!bVar77 * auVar93._0_4_;
                                bVar77 = (bool)((byte)(uVar61 >> 1) & 1);
                                fStack_5d9c = (float)((uint)bVar77 * auVar90._4_4_ |
                                                     (uint)!bVar77 * auVar93._4_4_);
                                bVar77 = (bool)((byte)(uVar61 >> 2) & 1);
                                fStack_5d98 = (float)((uint)bVar77 * auVar90._8_4_ |
                                                     (uint)!bVar77 * auVar93._8_4_);
                                bVar77 = (bool)((byte)(uVar61 >> 3) & 1);
                                fStack_5d94 = (float)((uint)bVar77 * auVar90._12_4_ |
                                                     (uint)!bVar77 * auVar93._12_4_);
                                bVar77 = (bool)((byte)(uVar61 >> 4) & 1);
                                fStack_5d90 = (float)((uint)bVar77 * auVar90._16_4_ |
                                                     (uint)!bVar77 * auVar93._16_4_);
                                bVar77 = (bool)((byte)(uVar61 >> 5) & 1);
                                fStack_5d8c = (float)((uint)bVar77 * auVar90._20_4_ |
                                                     (uint)!bVar77 * auVar93._20_4_);
                                bVar77 = (bool)((byte)(uVar61 >> 6) & 1);
                                fStack_5d88 = (float)((uint)bVar77 * auVar90._24_4_ |
                                                     (uint)!bVar77 * auVar93._24_4_);
                                bVar77 = SUB81(uVar61 >> 7,0);
                                auVar42._4_4_ = fVar147 * fStack_5d9c;
                                auVar42._0_4_ = fVar153 * (float)local_5de0._64_4_;
                                auVar42._8_4_ = fVar154 * fStack_5d98;
                                auVar42._12_4_ = fVar155 * fStack_5d94;
                                auVar42._16_4_ = fVar114 * fStack_5d90;
                                auVar42._20_4_ = fVar118 * fStack_5d8c;
                                auVar42._24_4_ = fVar119 * fStack_5d88;
                                auVar42._28_4_ = auVar159._28_4_;
                                auVar115 = vfmadd213ps_fma(auVar87,local_5de0._32_32_,auVar42);
                                auVar115 = vfmadd213ps_fma(auVar86,(undefined1  [32])vVar106.field_0
                                                           ,ZEXT1632(auVar115));
                                auVar87 = ZEXT1632(CONCAT412(auVar115._12_4_ + auVar115._12_4_,
                                                             CONCAT48(auVar115._8_4_ +
                                                                      auVar115._8_4_,
                                                                      CONCAT44(auVar115._4_4_ +
                                                                               auVar115._4_4_,
                                                                               auVar115._0_4_ +
                                                                               auVar115._0_4_))));
                                auVar149._0_4_ = auVar23._0_4_ * (float)local_5de0._64_4_;
                                auVar149._4_4_ = auVar23._4_4_ * fStack_5d9c;
                                auVar149._8_4_ = auVar23._8_4_ * fStack_5d98;
                                auVar149._12_4_ = auVar23._12_4_ * fStack_5d94;
                                auVar149._16_4_ = auVar23._16_4_ * fStack_5d90;
                                auVar149._20_4_ = auVar23._20_4_ * fStack_5d8c;
                                auVar149._24_4_ = auVar23._24_4_ * fStack_5d88;
                                auVar149._28_4_ = 0;
                                auVar115 = vfmadd213ps_fma(auVar22,local_5de0._32_32_,auVar149);
                                auVar81 = vfmadd213ps_fma(auVar107,(undefined1  [32])vVar106.field_0
                                                          ,ZEXT1632(auVar115));
                                auVar83 = vrcp14ps_avx512vl(auVar87);
                                in_ZMM7 = ZEXT3264(auVar83);
                                auVar85 = vxorps_avx512vl(auVar87,auVar88);
                                auVar159 = auVar160._0_32_;
                                auVar86 = vfnmadd213ps_avx512vl(auVar83,auVar87,auVar159);
                                auVar115 = vfmadd132ps_fma(auVar86,auVar83,auVar83);
                                vVar38.field_0 =
                                     (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                                     ZEXT1632(CONCAT412(auVar115._12_4_ *
                                                        (auVar81._12_4_ + auVar81._12_4_),
                                                        CONCAT48(auVar115._8_4_ *
                                                                 (auVar81._8_4_ + auVar81._8_4_),
                                                                 CONCAT44(auVar115._4_4_ *
                                                                          (auVar81._4_4_ +
                                                                          auVar81._4_4_),
                                                                          auVar115._0_4_ *
                                                                          (auVar81._0_4_ +
                                                                          auVar81._0_4_)))));
                                uVar24 = vcmpps_avx512vl((undefined1  [32])vVar38.field_0,
                                                         *(undefined1 (*) [32])(ray + 0x100),2);
                                uVar25 = vcmpps_avx512vl((undefined1  [32])vVar38.field_0,
                                                         *(undefined1 (*) [32])(ray + 0x60),0xd);
                                uVar26 = vcmpps_avx512vl(auVar87,auVar85,4);
                                bVar65 = bVar65 & (byte)uVar24 & (byte)uVar25 & (byte)uVar26;
                                if (bVar65 != 0) {
                                  uVar78 = CONCAT44(0,*(uint *)((long)&local_5e10 + lVar63 * 4));
                                  local_5ec0._0_8_ = uVar78;
                                  pGVar11 = (context->scene->geometries).items[uVar78].ptr;
                                  uVar4 = pGVar11->mask;
                                  auVar132._4_4_ = uVar4;
                                  auVar132._0_4_ = uVar4;
                                  auVar132._8_4_ = uVar4;
                                  auVar132._12_4_ = uVar4;
                                  auVar132._16_4_ = uVar4;
                                  auVar132._20_4_ = uVar4;
                                  auVar132._24_4_ = uVar4;
                                  auVar132._28_4_ = uVar4;
                                  in_ZMM7 = ZEXT3264(auVar132);
                                  uVar24 = vptestmd_avx512vl(auVar132,*(undefined1 (*) [32])
                                                                       (ray + 0x120));
                                  bVar75 = (byte)uVar24 & bVar65;
                                  if (bVar75 != 0) {
                                    local_5cc0._0_4_ =
                                         *(undefined4 *)((long)&local_5e20 + lVar63 * 4);
                                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                       (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                      auVar83 = vsubps_avx(auVar84,auVar99);
                                      auVar85 = vsubps_avx(auVar84,auVar101);
                                      auVar156 = auVar94._0_16_;
                                      auVar115 = vcvtsi2ss_avx512f(auVar156,*(ushort *)
                                                                             (lVar12 + 8 + lVar62) -
                                                                            1);
                                      auVar48._12_4_ = 0;
                                      auVar48._0_12_ = ZEXT812(0);
                                      auVar81 = vrcp14ss_avx512f(auVar48 << 0x20,
                                                                 ZEXT416(auVar115._0_4_));
                                      auVar115 = vfnmadd213ss_fma(auVar115,auVar81,
                                                                  SUB6416(ZEXT464(0x40000000),0));
                                      fVar153 = auVar81._0_4_ * auVar115._0_4_;
                                      auVar115 = vcvtsi2ss_avx512f(auVar156,*(ushort *)
                                                                             (lVar12 + 10 + lVar62)
                                                                            - 1);
                                      auVar81 = vcvtsi2ss_avx512f(auVar156,(uVar60 & 1) + local_5f24
                                                                 );
                                      fVar147 = auVar81._0_4_;
                                      auVar151._0_4_ = fVar147 * auVar84._0_4_ + auVar83._0_4_;
                                      auVar151._4_4_ = fVar147 * auVar84._4_4_ + auVar83._4_4_;
                                      auVar151._8_4_ = fVar147 * auVar84._8_4_ + auVar83._8_4_;
                                      auVar151._12_4_ = fVar147 * auVar84._12_4_ + auVar83._12_4_;
                                      auVar151._16_4_ = fVar147 * auVar84._16_4_ + auVar83._16_4_;
                                      auVar151._20_4_ = fVar147 * auVar84._20_4_ + auVar83._20_4_;
                                      auVar151._24_4_ = fVar147 * auVar84._24_4_ + auVar83._24_4_;
                                      auVar151._28_4_ = fVar147 + auVar83._28_4_;
                                      auVar137._4_4_ = fVar153;
                                      auVar137._0_4_ = fVar153;
                                      auVar137._8_4_ = fVar153;
                                      auVar137._12_4_ = fVar153;
                                      auVar137._16_4_ = fVar153;
                                      auVar137._20_4_ = fVar153;
                                      auVar137._24_4_ = fVar153;
                                      auVar137._28_4_ = fVar153;
                                      auVar86 = vmulps_avx512vl(auVar151,auVar137);
                                      fVar79 = (float)((uint)(bVar65 & 1) * auVar86._0_4_ |
                                                      (uint)!(bool)(bVar65 & 1) * (int)auVar83._0_4_
                                                      );
                                      bVar15 = (bool)(bVar65 >> 1 & 1);
                                      fVar108 = (float)((uint)bVar15 * auVar86._4_4_ |
                                                       (uint)!bVar15 * (int)auVar83._4_4_);
                                      bVar15 = (bool)(bVar65 >> 2 & 1);
                                      fVar110 = (float)((uint)bVar15 * auVar86._8_4_ |
                                                       (uint)!bVar15 * (int)auVar83._8_4_);
                                      bVar15 = (bool)(bVar65 >> 3 & 1);
                                      fVar112 = (float)((uint)bVar15 * auVar86._12_4_ |
                                                       (uint)!bVar15 * (int)auVar83._12_4_);
                                      bVar16 = (bool)(bVar65 >> 4 & 1);
                                      bVar17 = (bool)(bVar65 >> 5 & 1);
                                      bVar19 = (bool)(bVar65 >> 6 & 1);
                                      auVar82 = vrcp14ss_avx512f(auVar48 << 0x20,
                                                                 ZEXT416(auVar115._0_4_));
                                      auVar81 = vfnmadd213ss_fma(auVar115,auVar82,
                                                                 SUB6416(ZEXT464(0x40000000),0));
                                      auVar115 = vcvtsi2ss_avx512f(auVar156,(uVar60 >> 1) +
                                                                            local_5f28);
                                      fVar153 = auVar82._0_4_ * auVar81._0_4_;
                                      fVar147 = auVar115._0_4_;
                                      auVar141._0_4_ = fVar147 * auVar84._0_4_ + auVar85._0_4_;
                                      auVar141._4_4_ = fVar147 * auVar84._4_4_ + auVar85._4_4_;
                                      auVar141._8_4_ = fVar147 * auVar84._8_4_ + auVar85._8_4_;
                                      auVar141._12_4_ = fVar147 * auVar84._12_4_ + auVar85._12_4_;
                                      auVar145._16_4_ = fVar147 * auVar84._16_4_ + auVar85._16_4_;
                                      auVar145._0_16_ = auVar141;
                                      auVar145._20_4_ = fVar147 * auVar84._20_4_ + auVar85._20_4_;
                                      auVar145._24_4_ = fVar147 * auVar84._24_4_ + auVar85._24_4_;
                                      auVar145._28_4_ = fVar147 + auVar85._28_4_;
                                      auVar138._4_4_ = fVar153;
                                      auVar138._0_4_ = fVar153;
                                      auVar138._8_4_ = fVar153;
                                      auVar138._12_4_ = fVar153;
                                      auVar138._16_4_ = fVar153;
                                      auVar138._20_4_ = fVar153;
                                      auVar138._24_4_ = fVar153;
                                      auVar138._28_4_ = fVar153;
                                      auVar87 = vmulps_avx512vl(auVar145,auVar138);
                                      fVar80 = (float)((uint)(bVar65 & 1) * auVar87._0_4_ |
                                                      (uint)!(bool)(bVar65 & 1) * (int)auVar85._0_4_
                                                      );
                                      bVar15 = (bool)(bVar65 >> 1 & 1);
                                      fVar109 = (float)((uint)bVar15 * auVar87._4_4_ |
                                                       (uint)!bVar15 * (int)auVar85._4_4_);
                                      bVar15 = (bool)(bVar65 >> 2 & 1);
                                      fVar111 = (float)((uint)bVar15 * auVar87._8_4_ |
                                                       (uint)!bVar15 * (int)auVar85._8_4_);
                                      bVar15 = (bool)(bVar65 >> 3 & 1);
                                      fVar113 = (float)((uint)bVar15 * auVar87._12_4_ |
                                                       (uint)!bVar15 * (int)auVar85._12_4_);
                                      bVar15 = (bool)(bVar65 >> 4 & 1);
                                      bVar18 = (bool)(bVar65 >> 5 & 1);
                                      bVar20 = (bool)(bVar65 >> 6 & 1);
                                      auVar28._8_4_ = 0x219392ef;
                                      auVar28._0_8_ = 0x219392ef219392ef;
                                      auVar28._12_4_ = 0x219392ef;
                                      auVar28._16_4_ = 0x219392ef;
                                      auVar28._20_4_ = 0x219392ef;
                                      auVar28._24_4_ = 0x219392ef;
                                      auVar28._28_4_ = 0x219392ef;
                                      uVar78 = vcmpps_avx512vl(auVar84,auVar28,5);
                                      auVar107 = vrcp14ps_avx512vl(auVar84);
                                      auVar84 = vfnmadd213ps_avx512vl(auVar84,auVar107,auVar159);
                                      auVar84 = vfmadd132ps_avx512vl(auVar84,auVar107,auVar107);
                                      fVar119 = (float)((uint)((byte)uVar78 & 1) * auVar84._0_4_);
                                      fVar118 = (float)((uint)((byte)(uVar78 >> 1) & 1) *
                                                       auVar84._4_4_);
                                      fVar153 = (float)((uint)((byte)(uVar78 >> 2) & 1) *
                                                       auVar84._8_4_);
                                      fVar114 = (float)((uint)((byte)(uVar78 >> 3) & 1) *
                                                       auVar84._12_4_);
                                      fVar155 = (float)((uint)((byte)(uVar78 >> 4) & 1) *
                                                       auVar84._16_4_);
                                      fVar147 = (float)((uint)((byte)(uVar78 >> 5) & 1) *
                                                       auVar84._20_4_);
                                      fVar154 = (float)((uint)((byte)(uVar78 >> 6) & 1) *
                                                       auVar84._24_4_);
                                      auVar45._4_4_ = fVar108 * fVar118;
                                      auVar45._0_4_ = fVar79 * fVar119;
                                      auVar45._8_4_ = fVar110 * fVar153;
                                      auVar45._12_4_ = fVar112 * fVar114;
                                      auVar45._16_4_ =
                                           (float)((uint)bVar16 * auVar86._16_4_ |
                                                  (uint)!bVar16 * (int)auVar83._16_4_) * fVar155;
                                      auVar45._20_4_ =
                                           (float)((uint)bVar17 * auVar86._20_4_ |
                                                  (uint)!bVar17 * (int)auVar83._20_4_) * fVar147;
                                      auVar45._24_4_ =
                                           (float)((uint)bVar19 * auVar86._24_4_ |
                                                  (uint)!bVar19 * (int)auVar83._24_4_) * fVar154;
                                      auVar45._28_4_ = auVar107._28_4_;
                                      local_5d40 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                                                   vminps_avx512vl(auVar45,auVar159);
                                      auVar46._4_4_ = fVar109 * fVar118;
                                      auVar46._0_4_ = fVar80 * fVar119;
                                      auVar46._8_4_ = fVar111 * fVar153;
                                      auVar46._12_4_ = fVar113 * fVar114;
                                      auVar46._16_4_ =
                                           (float)((uint)bVar15 * auVar87._16_4_ |
                                                  (uint)!bVar15 * (int)auVar85._16_4_) * fVar155;
                                      auVar46._20_4_ =
                                           (float)((uint)bVar18 * auVar87._20_4_ |
                                                  (uint)!bVar18 * (int)auVar85._20_4_) * fVar147;
                                      auVar46._24_4_ =
                                           (float)((uint)bVar20 * auVar87._24_4_ |
                                                  (uint)!bVar20 * (int)auVar85._24_4_) * fVar154;
                                      auVar46._28_4_ = (uint)(byte)(uVar78 >> 7) * auVar84._28_4_;
                                      local_5d60 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                                                   vminps_avx512vl(auVar46,auVar159);
                                      uStack_5d84 = (uint)bVar77 * auVar90._28_4_ |
                                                    (uint)!bVar77 * auVar93._28_4_;
                                      local_5f20.geometryUserPtr = local_5ca0;
                                      local_5f20.valid = (int *)local_5c40;
                                      local_5f20.context = (RTCRayQueryContext *)&local_5c80;
                                      local_5f20.ray = (RTCRayN *)&local_5e40;
                                      auVar129 = ZEXT1664(CONCAT412(fVar112,CONCAT48(fVar110,
                                                  CONCAT44(fVar108,fVar79))));
                                      in_ZMM7 = ZEXT1664(CONCAT412(fVar113,CONCAT48(fVar111,CONCAT44
                                                  (fVar109,fVar80))));
                                      in_ZMM9 = ZEXT1664(auVar141);
                                      local_5de0._0_32_ = (undefined1  [32])vVar106.field_0;
                                      local_5d80 = vVar38.field_0;
                                      std::
                                      _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
                                      ::
                                      _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                                                ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                                                  *)&local_5f20,
                                                 (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                                                  *)local_5de0);
                                      pRVar14 = context->user;
                                      local_5d20 = vpbroadcastd_avx512vl();
                                      local_5d40 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                                                   vpbroadcastd_avx512vl();
                                      local_5de0._0_32_ = (undefined1  [32])local_5c40[0];
                                      local_5d80 = local_5e40;
                                      local_5d60 = local_5c80;
                                      auVar83 = vpcmpeqd_avx2(local_5d20,local_5d20);
                                      local_5ed8[1] = auVar83;
                                      *local_5ed8 = auVar83;
                                      local_5d00 = pRVar14->instID[0];
                                      uStack_5cfc = local_5d00;
                                      uStack_5cf8 = local_5d00;
                                      uStack_5cf4 = local_5d00;
                                      uStack_5cf0 = local_5d00;
                                      uStack_5cec = local_5d00;
                                      uStack_5ce8 = local_5d00;
                                      uStack_5ce4 = local_5d00;
                                      local_5ce0 = pRVar14->instPrimID[0];
                                      uStack_5cdc = local_5ce0;
                                      uStack_5cd8 = local_5ce0;
                                      uStack_5cd4 = local_5ce0;
                                      uStack_5cd0 = local_5ce0;
                                      uStack_5ccc = local_5ce0;
                                      uStack_5cc8 = local_5ce0;
                                      uStack_5cc4 = local_5ce0;
                                      local_5ec0 = *(undefined1 (*) [32])(ray + 0x100);
                                      auVar83 = vblendmps_avx512vl(local_5ec0,local_5ca0);
                                      bVar77 = (bool)(bVar75 >> 1 & 1);
                                      bVar15 = (bool)(bVar75 >> 2 & 1);
                                      bVar16 = (bool)(bVar75 >> 3 & 1);
                                      bVar17 = (bool)(bVar75 >> 4 & 1);
                                      bVar18 = (bool)(bVar75 >> 5 & 1);
                                      bVar19 = (bool)(bVar75 >> 6 & 1);
                                      *(uint *)(ray + 0x100) =
                                           (uint)(bVar75 & 1) * auVar83._0_4_ |
                                           !(bool)(bVar75 & 1) * local_5ce0;
                                      *(uint *)(ray + 0x104) =
                                           (uint)bVar77 * auVar83._4_4_ | !bVar77 * local_5ce0;
                                      *(uint *)(ray + 0x108) =
                                           (uint)bVar15 * auVar83._8_4_ | !bVar15 * local_5ce0;
                                      *(uint *)(ray + 0x10c) =
                                           (uint)bVar16 * auVar83._12_4_ | !bVar16 * local_5ce0;
                                      *(uint *)(ray + 0x110) =
                                           (uint)bVar17 * auVar83._16_4_ | !bVar17 * local_5ce0;
                                      *(uint *)(ray + 0x114) =
                                           (uint)bVar18 * auVar83._20_4_ | !bVar18 * local_5ce0;
                                      *(uint *)(ray + 0x118) =
                                           (uint)bVar19 * auVar83._24_4_ | !bVar19 * local_5ce0;
                                      *(uint *)(ray + 0x11c) =
                                           (uint)(bVar75 >> 7) * auVar83._28_4_ |
                                           !(bool)(bVar75 >> 7) * local_5ce0;
                                      local_5ea0 = vpmovm2d_avx512vl((ulong)bVar75);
                                      local_5f20.geometryUserPtr = pGVar11->userPtr;
                                      local_5f20.valid = (int *)local_5ea0;
                                      local_5f20.context = context->user;
                                      local_5f20.ray = (RTCRayN *)ray;
                                      local_5f20.hit = (RTCHitN *)local_5de0;
                                      local_5f20.N = 8;
                                      if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                        auVar129 = ZEXT1664(auVar129._0_16_);
                                        in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
                                        in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                                        (*pGVar11->occlusionFilterN)(&local_5f20);
                                      }
                                      if (local_5ea0 == (undefined1  [32])0x0) {
                                        uVar78 = 0;
                                        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                        auVar158 = ZEXT3264(auVar83);
                                        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                        auVar160 = ZEXT3264(auVar83);
                                        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                        auVar161 = ZEXT3264(auVar83);
                                        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                        auVar162 = ZEXT3264(auVar83);
                                        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                        auVar163 = ZEXT3264(auVar83);
                                        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                                        auVar164 = ZEXT3264(auVar83);
                                        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                        auVar157 = ZEXT3264(auVar83);
                                      }
                                      else {
                                        p_Var13 = context->args->filter;
                                        if (p_Var13 == (RTCFilterFunctionN)0x0) {
                                          auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                          auVar158 = ZEXT3264(auVar83);
                                          auVar83 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                          auVar160 = ZEXT3264(auVar83);
                                          auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                          auVar161 = ZEXT3264(auVar83);
                                          auVar83 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                          auVar162 = ZEXT3264(auVar83);
                                          auVar83 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                          auVar163 = ZEXT3264(auVar83);
                                          auVar83 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                                          auVar164 = ZEXT3264(auVar83);
                                          auVar83 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                          auVar157 = ZEXT3264(auVar83);
                                        }
                                        else {
                                          auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                          auVar158 = ZEXT3264(auVar83);
                                          auVar83 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                          auVar160 = ZEXT3264(auVar83);
                                          auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                          auVar161 = ZEXT3264(auVar83);
                                          auVar83 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                          auVar162 = ZEXT3264(auVar83);
                                          auVar83 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                          auVar163 = ZEXT3264(auVar83);
                                          auVar83 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                                          auVar164 = ZEXT3264(auVar83);
                                          auVar83 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                          auVar157 = ZEXT3264(auVar83);
                                          if (((context->args->flags &
                                               RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                             (((pGVar11->field_8).field_0x2 & 0x40) != 0)) {
                                            auVar129 = ZEXT1664(auVar129._0_16_);
                                            in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
                                            in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                                            (*p_Var13)(&local_5f20);
                                            auVar83 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                            auVar157 = ZEXT3264(auVar83);
                                            auVar83 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                                            auVar164 = ZEXT3264(auVar83);
                                            auVar83 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                            auVar163 = ZEXT3264(auVar83);
                                            auVar83 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                            auVar162 = ZEXT3264(auVar83);
                                            auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                            auVar161 = ZEXT3264(auVar83);
                                            auVar83 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                            auVar160 = ZEXT3264(auVar83);
                                            auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                            auVar158 = ZEXT3264(auVar83);
                                          }
                                        }
                                        uVar78 = vptestmd_avx512vl(local_5ea0,local_5ea0);
                                        iVar59 = *(int *)(local_5f20.ray + 0x104);
                                        iVar49 = *(int *)(local_5f20.ray + 0x108);
                                        iVar50 = *(int *)(local_5f20.ray + 0x10c);
                                        iVar51 = *(int *)(local_5f20.ray + 0x110);
                                        iVar52 = *(int *)(local_5f20.ray + 0x114);
                                        iVar53 = *(int *)(local_5f20.ray + 0x118);
                                        iVar54 = *(int *)(local_5f20.ray + 0x11c);
                                        auVar83 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                        bVar77 = (bool)((byte)uVar78 & 1);
                                        bVar15 = (bool)((byte)(uVar78 >> 1) & 1);
                                        bVar16 = (bool)((byte)(uVar78 >> 2) & 1);
                                        bVar17 = (bool)((byte)(uVar78 >> 3) & 1);
                                        bVar18 = (bool)((byte)(uVar78 >> 4) & 1);
                                        bVar19 = (bool)((byte)(uVar78 >> 5) & 1);
                                        bVar20 = (bool)((byte)(uVar78 >> 6) & 1);
                                        bVar21 = SUB81(uVar78 >> 7,0);
                                        *(uint *)&local_5f20.ray[0x100].field_0x0 =
                                             (uint)bVar77 * auVar83._0_4_ |
                                             (uint)!bVar77 *
                                             *(int *)&local_5f20.ray[0x100].field_0x0;
                                        *(uint *)(local_5f20.ray + 0x104) =
                                             (uint)bVar15 * auVar83._4_4_ | (uint)!bVar15 * iVar59;
                                        *(uint *)(local_5f20.ray + 0x108) =
                                             (uint)bVar16 * auVar83._8_4_ | (uint)!bVar16 * iVar49;
                                        *(uint *)(local_5f20.ray + 0x10c) =
                                             (uint)bVar17 * auVar83._12_4_ | (uint)!bVar17 * iVar50;
                                        *(uint *)(local_5f20.ray + 0x110) =
                                             (uint)bVar18 * auVar83._16_4_ | (uint)!bVar18 * iVar51;
                                        *(uint *)(local_5f20.ray + 0x114) =
                                             (uint)bVar19 * auVar83._20_4_ | (uint)!bVar19 * iVar52;
                                        *(uint *)(local_5f20.ray + 0x118) =
                                             (uint)bVar20 * auVar83._24_4_ | (uint)!bVar20 * iVar53;
                                        *(uint *)(local_5f20.ray + 0x11c) =
                                             (uint)bVar21 * auVar83._28_4_ | (uint)!bVar21 * iVar54;
                                      }
                                      bVar75 = (byte)uVar78;
                                      bVar77 = (bool)((byte)(uVar78 >> 1) & 1);
                                      bVar15 = (bool)((byte)(uVar78 >> 2) & 1);
                                      bVar16 = (bool)((byte)(uVar78 >> 3) & 1);
                                      bVar17 = (bool)((byte)(uVar78 >> 4) & 1);
                                      bVar18 = (bool)((byte)(uVar78 >> 5) & 1);
                                      bVar19 = (bool)((byte)(uVar78 >> 6) & 1);
                                      bVar20 = SUB81(uVar78 >> 7,0);
                                      *(uint *)local_5ef0 =
                                           (uint)(bVar75 & 1) * *(int *)local_5ef0 |
                                           (uint)!(bool)(bVar75 & 1) * local_5ec0._0_4_;
                                      *(uint *)(local_5ef0 + 4) =
                                           (uint)bVar77 * *(int *)(local_5ef0 + 4) |
                                           (uint)!bVar77 * local_5ec0._4_4_;
                                      *(uint *)(local_5ef0 + 8) =
                                           (uint)bVar15 * *(int *)(local_5ef0 + 8) |
                                           (uint)!bVar15 * local_5ec0._8_4_;
                                      *(uint *)(local_5ef0 + 0xc) =
                                           (uint)bVar16 * *(int *)(local_5ef0 + 0xc) |
                                           (uint)!bVar16 * local_5ec0._12_4_;
                                      *(uint *)(local_5ef0 + 0x10) =
                                           (uint)bVar17 * *(int *)(local_5ef0 + 0x10) |
                                           (uint)!bVar17 * local_5ec0._16_4_;
                                      *(uint *)(local_5ef0 + 0x14) =
                                           (uint)bVar18 * *(int *)(local_5ef0 + 0x14) |
                                           (uint)!bVar18 * local_5ec0._20_4_;
                                      *(uint *)(local_5ef0 + 0x18) =
                                           (uint)bVar19 * *(int *)(local_5ef0 + 0x18) |
                                           (uint)!bVar19 * local_5ec0._24_4_;
                                      *(uint *)(local_5ef0 + 0x1c) =
                                           (uint)bVar20 * *(int *)(local_5ef0 + 0x1c) |
                                           (uint)!bVar20 * local_5ec0._28_4_;
                                    }
                                    bVar66 = bVar76 & ~bVar75;
                                  }
                                }
                              }
                            }
                            lVar63 = lVar63 + 1;
                            puVar74 = puVar74 + 0x10;
                          } while (bVar66 != 0);
                          bVar66 = 0;
LAB_01def816:
                          bVar70 = bVar70 & bVar66;
                          bVar77 = bVar70 == 0;
                          uVar64 = local_5ec8;
                          lVar63 = local_5e48;
                          uVar78 = local_5ee8;
                          puVar69 = local_5ed0;
                        }
                      } while ((!bVar77) && (uVar64 = uVar64 - 1 & uVar64, uVar64 != 0));
                    }
                    lVar63 = local_5e50 + 1;
                  }
                  bVar70 = (byte)local_5f5c | ~bVar70;
                  local_5f5c = (uint)bVar70;
                  if (bVar70 == 0xff) {
                    local_5f5c._0_1_ = 0xff;
                    goto LAB_01def9b6;
                  }
                  auVar83 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar77 = (bool)(bVar70 >> 1 & 1);
                  bVar15 = (bool)(bVar70 >> 2 & 1);
                  bVar16 = (bool)(bVar70 >> 3 & 1);
                  bVar17 = (bool)(bVar70 >> 4 & 1);
                  bVar18 = (bool)(bVar70 >> 5 & 1);
                  bVar19 = (bool)(bVar70 >> 6 & 1);
                  local_5a40._4_4_ = (uint)bVar77 * auVar83._4_4_ | (uint)!bVar77 * local_5a40._4_4_
                  ;
                  local_5a40._0_4_ =
                       (uint)(bVar70 & 1) * auVar83._0_4_ |
                       (uint)!(bool)(bVar70 & 1) * local_5a40._0_4_;
                  local_5a40._8_4_ = (uint)bVar15 * auVar83._8_4_ | (uint)!bVar15 * local_5a40._8_4_
                  ;
                  local_5a40._12_4_ =
                       (uint)bVar16 * auVar83._12_4_ | (uint)!bVar16 * local_5a40._12_4_;
                  local_5a40._16_4_ =
                       (uint)bVar17 * auVar83._16_4_ | (uint)!bVar17 * local_5a40._16_4_;
                  local_5a40._20_4_ =
                       (uint)bVar18 * auVar83._20_4_ | (uint)!bVar18 * local_5a40._20_4_;
                  local_5a40._24_4_ =
                       (uint)bVar19 * auVar83._24_4_ | (uint)!bVar19 * local_5a40._24_4_;
                  local_5a40._28_4_ =
                       (uint)(bVar70 >> 7) * auVar83._28_4_ |
                       (uint)!(bool)(bVar70 >> 7) * local_5a40._28_4_;
                }
                goto LAB_01dee0a6;
              }
              auVar83 = auVar161._0_32_;
              for (lVar63 = 0;
                  (auVar152 = ZEXT3264(auVar83), lVar63 != 8 &&
                  (uVar64 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar63 * 8), uVar64 != 8));
                  lVar63 = lVar63 + 1) {
                uVar73 = *(undefined4 *)(root.ptr + 0x40 + lVar63 * 4);
                auVar100._4_4_ = uVar73;
                auVar100._0_4_ = uVar73;
                auVar100._8_4_ = uVar73;
                auVar100._12_4_ = uVar73;
                auVar100._16_4_ = uVar73;
                auVar100._20_4_ = uVar73;
                auVar100._24_4_ = uVar73;
                auVar100._28_4_ = uVar73;
                auVar85._8_8_ = local_5be0._8_8_;
                auVar85._0_8_ = local_5be0._0_8_;
                auVar85._16_8_ = local_5be0._16_8_;
                auVar85._24_8_ = local_5be0._24_8_;
                auVar22._8_8_ = local_5be0._40_8_;
                auVar22._0_8_ = local_5be0._32_8_;
                auVar22._16_8_ = local_5be0._48_8_;
                auVar22._24_8_ = local_5be0._56_8_;
                auVar23._8_8_ = local_5be0._72_8_;
                auVar23._0_8_ = local_5be0._64_8_;
                auVar23._16_8_ = local_5be0._80_8_;
                auVar23._24_8_ = local_5be0._88_8_;
                auVar84 = vsubps_avx(auVar100,auVar85);
                auVar152._0_4_ = (float)local_5b20._0_4_ * auVar84._0_4_;
                auVar152._4_4_ = (float)local_5b20._4_4_ * auVar84._4_4_;
                auVar152._8_4_ = fStack_5b18 * auVar84._8_4_;
                auVar152._12_4_ = fStack_5b14 * auVar84._12_4_;
                auVar152._16_4_ = fStack_5b10 * auVar84._16_4_;
                auVar152._20_4_ = fStack_5b0c * auVar84._20_4_;
                auVar152._28_36_ = auVar129._28_36_;
                auVar152._24_4_ = fStack_5b08 * auVar84._24_4_;
                auVar100 = auVar152._0_32_;
                auVar129 = ZEXT3264(auVar100);
                uVar73 = *(undefined4 *)(root.ptr + 0x80 + lVar63 * 4);
                auVar88._4_4_ = uVar73;
                auVar88._0_4_ = uVar73;
                auVar88._8_4_ = uVar73;
                auVar88._12_4_ = uVar73;
                auVar88._16_4_ = uVar73;
                auVar88._20_4_ = uVar73;
                auVar88._24_4_ = uVar73;
                auVar88._28_4_ = uVar73;
                auVar84 = vsubps_avx(auVar88,auVar22);
                auVar133._0_4_ = (float)local_5b00._0_4_ * auVar84._0_4_;
                auVar133._4_4_ = (float)local_5b00._4_4_ * auVar84._4_4_;
                auVar133._8_4_ = fStack_5af8 * auVar84._8_4_;
                auVar133._12_4_ = fStack_5af4 * auVar84._12_4_;
                auVar133._16_4_ = fStack_5af0 * auVar84._16_4_;
                auVar133._20_4_ = fStack_5aec * auVar84._20_4_;
                auVar133._28_36_ = in_ZMM7._28_36_;
                auVar133._24_4_ = fStack_5ae8 * auVar84._24_4_;
                auVar88 = auVar133._0_32_;
                in_ZMM7 = ZEXT3264(auVar88);
                uVar73 = *(undefined4 *)(root.ptr + 0xc0 + lVar63 * 4);
                auVar89._4_4_ = uVar73;
                auVar89._0_4_ = uVar73;
                auVar89._8_4_ = uVar73;
                auVar89._12_4_ = uVar73;
                auVar89._16_4_ = uVar73;
                auVar89._20_4_ = uVar73;
                auVar89._24_4_ = uVar73;
                auVar89._28_4_ = uVar73;
                auVar84 = vsubps_avx(auVar89,auVar23);
                auVar146._0_4_ = (float)local_5ae0._0_4_ * auVar84._0_4_;
                auVar146._4_4_ = (float)local_5ae0._4_4_ * auVar84._4_4_;
                auVar146._8_4_ = fStack_5ad8 * auVar84._8_4_;
                auVar146._12_4_ = fStack_5ad4 * auVar84._12_4_;
                auVar146._16_4_ = fStack_5ad0 * auVar84._16_4_;
                auVar146._20_4_ = fStack_5acc * auVar84._20_4_;
                auVar146._28_36_ = in_ZMM9._28_36_;
                auVar146._24_4_ = fStack_5ac8 * auVar84._24_4_;
                auVar89 = auVar146._0_32_;
                in_ZMM9 = ZEXT3264(auVar89);
                uVar73 = *(undefined4 *)(root.ptr + 0x60 + lVar63 * 4);
                auVar90._4_4_ = uVar73;
                auVar90._0_4_ = uVar73;
                auVar90._8_4_ = uVar73;
                auVar90._12_4_ = uVar73;
                auVar90._16_4_ = uVar73;
                auVar90._20_4_ = uVar73;
                auVar90._24_4_ = uVar73;
                auVar90._28_4_ = uVar73;
                auVar84 = vsubps_avx(auVar90,auVar85);
                auVar86._4_4_ = (float)local_5b20._4_4_ * auVar84._4_4_;
                auVar86._0_4_ = (float)local_5b20._0_4_ * auVar84._0_4_;
                auVar86._8_4_ = fStack_5b18 * auVar84._8_4_;
                auVar86._12_4_ = fStack_5b14 * auVar84._12_4_;
                auVar86._16_4_ = fStack_5b10 * auVar84._16_4_;
                auVar86._20_4_ = fStack_5b0c * auVar84._20_4_;
                auVar86._24_4_ = fStack_5b08 * auVar84._24_4_;
                auVar86._28_4_ = (int)((ulong)local_5be0._24_8_ >> 0x20);
                uVar73 = *(undefined4 *)(root.ptr + 0xa0 + lVar63 * 4);
                auVar91._4_4_ = uVar73;
                auVar91._0_4_ = uVar73;
                auVar91._8_4_ = uVar73;
                auVar91._12_4_ = uVar73;
                auVar91._16_4_ = uVar73;
                auVar91._20_4_ = uVar73;
                auVar91._24_4_ = uVar73;
                auVar91._28_4_ = uVar73;
                auVar84 = vsubps_avx(auVar91,auVar22);
                auVar159._4_4_ = (float)local_5b00._4_4_ * auVar84._4_4_;
                auVar159._0_4_ = (float)local_5b00._0_4_ * auVar84._0_4_;
                auVar159._8_4_ = fStack_5af8 * auVar84._8_4_;
                auVar159._12_4_ = fStack_5af4 * auVar84._12_4_;
                auVar159._16_4_ = fStack_5af0 * auVar84._16_4_;
                auVar159._20_4_ = fStack_5aec * auVar84._20_4_;
                auVar159._24_4_ = fStack_5ae8 * auVar84._24_4_;
                auVar159._28_4_ = (int)((ulong)local_5be0._56_8_ >> 0x20);
                uVar73 = *(undefined4 *)(root.ptr + 0xe0 + lVar63 * 4);
                auVar92._4_4_ = uVar73;
                auVar92._0_4_ = uVar73;
                auVar92._8_4_ = uVar73;
                auVar92._12_4_ = uVar73;
                auVar92._16_4_ = uVar73;
                auVar92._20_4_ = uVar73;
                auVar92._24_4_ = uVar73;
                auVar92._28_4_ = uVar73;
                auVar84 = vsubps_avx(auVar92,auVar23);
                auVar107._4_4_ = (float)local_5ae0._4_4_ * auVar84._4_4_;
                auVar107._0_4_ = (float)local_5ae0._0_4_ * auVar84._0_4_;
                auVar107._8_4_ = fStack_5ad8 * auVar84._8_4_;
                auVar107._12_4_ = fStack_5ad4 * auVar84._12_4_;
                auVar107._16_4_ = fStack_5ad0 * auVar84._16_4_;
                auVar107._20_4_ = fStack_5acc * auVar84._20_4_;
                auVar107._24_4_ = fStack_5ac8 * auVar84._24_4_;
                auVar107._28_4_ = (int)((ulong)local_5be0._88_8_ >> 0x20);
                auVar84 = vminps_avx(auVar100,auVar86);
                auVar85 = vminps_avx(auVar88,auVar159);
                auVar84 = vmaxps_avx(auVar84,auVar85);
                auVar85 = vminps_avx(auVar89,auVar107);
                auVar84 = vmaxps_avx(auVar84,auVar85);
                auVar87 = vmulps_avx512vl(auVar84,auVar162._0_32_);
                auVar84 = vmaxps_avx(auVar100,auVar86);
                auVar85 = vmaxps_avx(auVar88,auVar159);
                auVar85 = vminps_avx(auVar84,auVar85);
                auVar84 = vmaxps_avx(auVar89,auVar107);
                auVar84 = vminps_avx(auVar85,auVar84);
                auVar85 = vmulps_avx512vl(auVar84,auVar163._0_32_);
                auVar84 = vmaxps_avx(auVar87,local_5a60);
                auVar85 = vminps_avx(auVar85,local_5a40);
                uVar61 = vcmpps_avx512vl(auVar84,auVar85,2);
                uVar58 = uVar71;
                auVar84 = auVar83;
                if ((byte)uVar61 != 0) {
                  auVar85 = vblendmps_avx512vl(auVar161._0_32_,auVar87);
                  bVar77 = (bool)((byte)uVar61 & 1);
                  auVar84._0_4_ = (uint)bVar77 * auVar85._0_4_ | (uint)!bVar77 * auVar87._0_4_;
                  bVar77 = (bool)((byte)(uVar61 >> 1) & 1);
                  auVar84._4_4_ = (uint)bVar77 * auVar85._4_4_ | (uint)!bVar77 * auVar87._4_4_;
                  bVar77 = (bool)((byte)(uVar61 >> 2) & 1);
                  auVar84._8_4_ = (uint)bVar77 * auVar85._8_4_ | (uint)!bVar77 * auVar87._8_4_;
                  bVar77 = (bool)((byte)(uVar61 >> 3) & 1);
                  auVar84._12_4_ = (uint)bVar77 * auVar85._12_4_ | (uint)!bVar77 * auVar87._12_4_;
                  bVar77 = (bool)((byte)(uVar61 >> 4) & 1);
                  auVar84._16_4_ = (uint)bVar77 * auVar85._16_4_ | (uint)!bVar77 * auVar87._16_4_;
                  bVar77 = (bool)((byte)(uVar61 >> 5) & 1);
                  auVar84._20_4_ = (uint)bVar77 * auVar85._20_4_ | (uint)!bVar77 * auVar87._20_4_;
                  bVar77 = (bool)((byte)(uVar61 >> 6) & 1);
                  auVar84._24_4_ = (uint)bVar77 * auVar85._24_4_ | (uint)!bVar77 * auVar87._24_4_;
                  bVar77 = SUB81(uVar61 >> 7,0);
                  auVar84._28_4_ = (uint)bVar77 * auVar85._28_4_ | (uint)!bVar77 * auVar87._28_4_;
                  uVar58 = uVar64;
                  if (uVar71 != 8) {
                    *puVar69 = uVar71;
                    puVar69 = puVar69 + 1;
                    *pauVar72 = auVar83;
                    pauVar72 = pauVar72 + 1;
                  }
                }
                auVar83 = auVar84;
                uVar71 = uVar58;
              }
              if (uVar71 == 8) goto LAB_01dee27a;
              uVar24 = vcmpps_avx512vl(auVar83,local_5a40,9);
              root.ptr = uVar71;
            } while ((byte)uVar78 < (byte)POPCOUNT((int)uVar24));
            *puVar69 = uVar71;
            puVar69 = puVar69 + 1;
            *pauVar72 = auVar83;
            pauVar72 = pauVar72 + 1;
LAB_01dee27a:
            iVar59 = 4;
          }
          else {
            local_5ec0 = auVar83;
            while (bVar70 = (byte)local_5f5c, uVar71 != 0) {
              k = 0;
              for (uVar78 = uVar71; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000) {
                k = k + 1;
              }
              uVar71 = uVar71 - 1 & uVar71;
              auVar129 = ZEXT1664(auVar129._0_16_);
              in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
              in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
              bVar77 = occluded1(local_5e60,local_5e68,root,k,&local_5f29,ray,
                                 (TravRayK<8,_true> *)&local_5be0.field_0,context);
              bVar66 = (byte)(1 << ((uint)k & 0x1f));
              if (!bVar77) {
                bVar66 = 0;
              }
              local_5f5c = (uint)(bVar70 | bVar66);
              uVar78 = local_5ee8;
            }
            iVar59 = 3;
            auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar158 = ZEXT3264(auVar83);
            auVar83 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar160 = ZEXT3264(auVar83);
            auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar161 = ZEXT3264(auVar83);
            auVar83 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
            auVar162 = ZEXT3264(auVar83);
            auVar83 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
            auVar163 = ZEXT3264(auVar83);
            auVar83 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
            auVar164 = ZEXT3264(auVar83);
            auVar83 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar157 = ZEXT3264(auVar83);
            auVar152 = ZEXT3264(local_5ec0);
            if (bVar70 != 0xff) {
              auVar83 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              local_5a40._0_4_ =
                   (uint)(bVar70 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar70 & 1) * local_5a40._0_4_
              ;
              bVar77 = (bool)((byte)(local_5f5c >> 1) & 1);
              local_5a40._4_4_ = (uint)bVar77 * auVar83._4_4_ | (uint)!bVar77 * local_5a40._4_4_;
              bVar77 = (bool)((byte)(local_5f5c >> 2) & 1);
              local_5a40._8_4_ = (uint)bVar77 * auVar83._8_4_ | (uint)!bVar77 * local_5a40._8_4_;
              bVar77 = (bool)((byte)(local_5f5c >> 3) & 1);
              local_5a40._12_4_ = (uint)bVar77 * auVar83._12_4_ | (uint)!bVar77 * local_5a40._12_4_;
              bVar77 = (bool)((byte)(local_5f5c >> 4) & 1);
              local_5a40._16_4_ = (uint)bVar77 * auVar83._16_4_ | (uint)!bVar77 * local_5a40._16_4_;
              bVar77 = (bool)((byte)(local_5f5c >> 5) & 1);
              local_5a40._20_4_ = (uint)bVar77 * auVar83._20_4_ | (uint)!bVar77 * local_5a40._20_4_;
              bVar77 = (bool)((byte)(local_5f5c >> 6) & 1);
              local_5a40._24_4_ = (uint)bVar77 * auVar83._24_4_ | (uint)!bVar77 * local_5a40._24_4_;
              local_5a40._28_4_ =
                   (local_5f5c >> 7) * auVar83._28_4_ |
                   (uint)!SUB41(local_5f5c >> 7,0) * local_5a40._28_4_;
              iVar59 = 2;
            }
            if ((uint)uVar78 < (uint)POPCOUNT(uVar73)) goto LAB_01dee0ee;
          }
          if (iVar59 == 3) {
LAB_01def9b6:
            local_5f5c._0_1_ = (byte)local_5f5c & (byte)local_5ee0;
            bVar77 = (bool)((byte)local_5f5c >> 1 & 1);
            bVar15 = (bool)((byte)local_5f5c >> 2 & 1);
            bVar16 = (bool)((byte)local_5f5c >> 3 & 1);
            bVar17 = (bool)((byte)local_5f5c >> 4 & 1);
            bVar18 = (bool)((byte)local_5f5c >> 5 & 1);
            bVar19 = (bool)((byte)local_5f5c >> 6 & 1);
            *(uint *)local_5ef0 =
                 (uint)((byte)local_5f5c & 1) * -0x800000 |
                 (uint)!(bool)((byte)local_5f5c & 1) * *(int *)local_5ef0;
            *(uint *)(local_5ef0 + 4) =
                 (uint)bVar77 * -0x800000 | (uint)!bVar77 * *(int *)(local_5ef0 + 4);
            *(uint *)(local_5ef0 + 8) =
                 (uint)bVar15 * -0x800000 | (uint)!bVar15 * *(int *)(local_5ef0 + 8);
            *(uint *)(local_5ef0 + 0xc) =
                 (uint)bVar16 * -0x800000 | (uint)!bVar16 * *(int *)(local_5ef0 + 0xc);
            *(uint *)(local_5ef0 + 0x10) =
                 (uint)bVar17 * -0x800000 | (uint)!bVar17 * *(int *)(local_5ef0 + 0x10);
            *(uint *)(local_5ef0 + 0x14) =
                 (uint)bVar18 * -0x800000 | (uint)!bVar18 * *(int *)(local_5ef0 + 0x14);
            *(uint *)(local_5ef0 + 0x18) =
                 (uint)bVar19 * -0x800000 | (uint)!bVar19 * *(int *)(local_5ef0 + 0x18);
            *(uint *)(local_5ef0 + 0x1c) =
                 (uint)((byte)local_5f5c >> 7) * -0x800000 |
                 (uint)!(bool)((byte)local_5f5c >> 7) * *(int *)(local_5ef0 + 0x1c);
            return;
          }
        } while( true );
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }